

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_add_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_gej *b,secp256k1_fe *rzr)

{
  uint64_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  undefined1 auVar641 [16];
  undefined1 auVar642 [16];
  undefined1 auVar643 [16];
  undefined1 auVar644 [16];
  undefined1 auVar645 [16];
  undefined1 auVar646 [16];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [16];
  undefined1 auVar659 [16];
  undefined1 auVar660 [16];
  undefined1 auVar661 [16];
  undefined1 auVar662 [16];
  undefined1 auVar663 [16];
  undefined1 auVar664 [16];
  undefined1 auVar665 [16];
  undefined1 auVar666 [16];
  undefined1 auVar667 [16];
  undefined1 auVar668 [16];
  undefined1 auVar669 [16];
  undefined1 auVar670 [16];
  undefined1 auVar671 [16];
  undefined1 auVar672 [16];
  undefined1 auVar673 [16];
  undefined1 auVar674 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar677 [16];
  undefined1 auVar678 [16];
  undefined1 auVar679 [16];
  undefined1 auVar680 [16];
  undefined1 auVar681 [16];
  undefined1 auVar682 [16];
  undefined1 auVar683 [16];
  undefined1 auVar684 [16];
  undefined1 auVar685 [16];
  undefined1 auVar686 [16];
  undefined1 auVar687 [16];
  undefined1 auVar688 [16];
  undefined1 auVar689 [16];
  undefined1 auVar690 [16];
  undefined1 auVar691 [16];
  undefined1 auVar692 [16];
  undefined1 auVar693 [16];
  undefined1 auVar694 [16];
  undefined1 auVar695 [16];
  undefined1 auVar696 [16];
  undefined1 auVar697 [16];
  undefined1 auVar698 [16];
  undefined1 auVar699 [16];
  undefined1 auVar700 [16];
  undefined1 auVar701 [16];
  undefined1 auVar702 [16];
  undefined1 auVar703 [16];
  undefined1 auVar704 [16];
  undefined1 auVar705 [16];
  undefined1 auVar706 [16];
  undefined1 auVar707 [16];
  undefined1 auVar708 [16];
  undefined1 auVar709 [16];
  undefined1 auVar710 [16];
  undefined1 auVar711 [16];
  undefined1 auVar712 [16];
  undefined1 auVar713 [16];
  undefined1 auVar714 [16];
  undefined1 auVar715 [16];
  undefined1 auVar716 [16];
  undefined1 auVar717 [16];
  undefined1 auVar718 [16];
  undefined1 auVar719 [16];
  undefined1 auVar720 [16];
  undefined1 auVar721 [16];
  undefined1 auVar722 [16];
  undefined1 auVar723 [16];
  undefined1 auVar724 [16];
  undefined1 auVar725 [16];
  undefined1 auVar726 [16];
  undefined1 auVar727 [16];
  undefined1 auVar728 [16];
  undefined1 auVar729 [16];
  undefined1 auVar730 [16];
  undefined1 auVar731 [16];
  undefined1 auVar732 [16];
  undefined1 auVar733 [16];
  undefined1 auVar734 [16];
  undefined1 auVar735 [16];
  undefined1 auVar736 [16];
  undefined1 auVar737 [16];
  undefined1 auVar738 [16];
  undefined1 auVar739 [16];
  undefined1 auVar740 [16];
  undefined1 auVar741 [16];
  undefined1 auVar742 [16];
  undefined1 auVar743 [16];
  undefined1 auVar744 [16];
  undefined1 auVar745 [16];
  undefined1 auVar746 [16];
  undefined1 auVar747 [16];
  undefined1 auVar748 [16];
  undefined1 auVar749 [16];
  undefined1 auVar750 [16];
  undefined1 auVar751 [16];
  undefined1 auVar752 [16];
  undefined1 auVar753 [16];
  undefined1 auVar754 [16];
  undefined1 auVar755 [16];
  undefined1 auVar756 [16];
  undefined1 auVar757 [16];
  undefined1 auVar758 [16];
  undefined1 auVar759 [16];
  undefined1 auVar760 [16];
  undefined1 auVar761 [16];
  undefined1 auVar762 [16];
  undefined1 auVar763 [16];
  undefined1 auVar764 [16];
  undefined1 auVar765 [16];
  undefined1 auVar766 [16];
  undefined1 auVar767 [16];
  undefined1 auVar768 [16];
  undefined1 auVar769 [16];
  undefined1 auVar770 [16];
  undefined1 auVar771 [16];
  undefined1 auVar772 [16];
  undefined1 auVar773 [16];
  undefined1 auVar774 [16];
  undefined1 auVar775 [16];
  undefined1 auVar776 [16];
  undefined1 auVar777 [16];
  undefined1 auVar778 [16];
  undefined1 auVar779 [16];
  undefined1 auVar780 [16];
  undefined1 auVar781 [16];
  undefined1 auVar782 [16];
  undefined1 auVar783 [16];
  undefined1 auVar784 [16];
  undefined1 auVar785 [16];
  undefined1 auVar786 [16];
  undefined1 auVar787 [16];
  undefined1 auVar788 [16];
  undefined1 auVar789 [16];
  undefined1 auVar790 [16];
  undefined1 auVar791 [16];
  undefined1 auVar792 [16];
  undefined1 auVar793 [16];
  undefined1 auVar794 [16];
  undefined1 auVar795 [16];
  undefined1 auVar796 [16];
  undefined1 auVar797 [16];
  undefined1 auVar798 [16];
  undefined1 auVar799 [16];
  undefined1 auVar800 [16];
  undefined1 auVar801 [16];
  undefined1 auVar802 [16];
  undefined1 auVar803 [16];
  undefined1 auVar804 [16];
  undefined1 auVar805 [16];
  undefined1 auVar806 [16];
  undefined1 auVar807 [16];
  undefined1 auVar808 [16];
  undefined1 auVar809 [16];
  undefined1 auVar810 [16];
  undefined1 auVar811 [16];
  undefined1 auVar812 [16];
  undefined1 auVar813 [16];
  undefined1 auVar814 [16];
  undefined1 auVar815 [16];
  undefined1 auVar816 [16];
  undefined1 auVar817 [16];
  undefined1 auVar818 [16];
  undefined1 auVar819 [16];
  undefined1 auVar820 [16];
  undefined1 auVar821 [16];
  undefined1 auVar822 [16];
  undefined1 auVar823 [16];
  undefined1 auVar824 [16];
  undefined1 auVar825 [16];
  undefined1 auVar826 [16];
  undefined1 auVar827 [16];
  undefined1 auVar828 [16];
  undefined1 auVar829 [16];
  undefined1 auVar830 [16];
  undefined1 auVar831 [16];
  undefined1 auVar832 [16];
  undefined1 auVar833 [16];
  undefined1 auVar834 [16];
  undefined1 auVar835 [16];
  undefined1 auVar836 [16];
  undefined1 auVar837 [16];
  undefined1 auVar838 [16];
  undefined1 auVar839 [16];
  undefined1 auVar840 [16];
  undefined1 auVar841 [16];
  undefined1 auVar842 [16];
  undefined1 auVar843 [16];
  undefined1 auVar844 [16];
  undefined1 auVar845 [16];
  undefined1 auVar846 [16];
  undefined1 auVar847 [16];
  undefined1 auVar848 [16];
  undefined1 auVar849 [16];
  undefined1 auVar850 [16];
  undefined1 auVar851 [16];
  undefined1 auVar852 [16];
  undefined1 auVar853 [16];
  undefined1 auVar854 [16];
  undefined1 auVar855 [16];
  undefined1 auVar856 [16];
  undefined1 auVar857 [16];
  undefined1 auVar858 [16];
  undefined1 auVar859 [16];
  undefined1 auVar860 [16];
  undefined1 auVar861 [16];
  undefined1 auVar862 [16];
  undefined1 auVar863 [16];
  undefined1 auVar864 [16];
  undefined1 auVar865 [16];
  undefined1 auVar866 [16];
  undefined1 auVar867 [16];
  undefined1 auVar868 [16];
  undefined1 auVar869 [16];
  undefined1 auVar870 [16];
  undefined1 auVar871 [16];
  undefined1 auVar872 [16];
  undefined1 auVar873 [16];
  undefined1 auVar874 [16];
  undefined1 auVar875 [16];
  undefined1 auVar876 [16];
  undefined1 auVar877 [16];
  undefined1 auVar878 [16];
  undefined1 auVar879 [16];
  undefined1 auVar880 [16];
  undefined1 auVar881 [16];
  undefined1 auVar882 [16];
  undefined1 auVar883 [16];
  undefined1 auVar884 [16];
  undefined1 auVar885 [16];
  undefined1 auVar886 [16];
  undefined1 auVar887 [16];
  undefined1 auVar888 [16];
  undefined1 auVar889 [16];
  undefined1 auVar890 [16];
  undefined1 auVar891 [16];
  undefined1 auVar892 [16];
  undefined1 auVar893 [16];
  undefined1 auVar894 [16];
  undefined1 auVar895 [16];
  undefined1 auVar896 [16];
  undefined1 auVar897 [16];
  undefined1 auVar898 [16];
  undefined1 auVar899 [16];
  undefined1 auVar900 [16];
  undefined1 auVar901 [16];
  undefined1 auVar902 [16];
  undefined1 auVar903 [16];
  undefined1 auVar904 [16];
  undefined1 auVar905 [16];
  undefined1 auVar906 [16];
  undefined1 auVar907 [16];
  undefined1 auVar908 [16];
  undefined1 auVar909 [16];
  undefined1 auVar910 [16];
  undefined1 auVar911 [16];
  undefined1 auVar912 [16];
  undefined1 auVar913 [16];
  undefined1 auVar914 [16];
  undefined1 auVar915 [16];
  undefined1 auVar916 [16];
  undefined1 auVar917 [16];
  undefined1 auVar918 [16];
  undefined1 auVar919 [16];
  undefined1 auVar920 [16];
  undefined1 auVar921 [16];
  undefined1 auVar922 [16];
  undefined1 auVar923 [16];
  undefined1 auVar924 [16];
  undefined1 auVar925 [16];
  undefined1 auVar926 [16];
  undefined1 auVar927 [16];
  undefined1 auVar928 [16];
  undefined1 auVar929 [16];
  secp256k1_gej *r_00;
  int iVar930;
  ulong uVar931;
  ulong uVar932;
  ulong uVar933;
  ulong uVar934;
  ulong uVar935;
  ulong uVar936;
  ulong uVar937;
  ulong uVar938;
  ulong uVar939;
  long lVar940;
  ulong uVar941;
  ulong uVar942;
  ulong uVar943;
  ulong uVar944;
  uint64_t uVar945;
  uint64_t uVar946;
  uint64_t uVar947;
  ulong uVar948;
  ulong uVar949;
  ulong uVar950;
  ulong uVar951;
  ulong uVar952;
  ulong uVar953;
  ulong uVar954;
  ulong uVar955;
  ulong uVar956;
  ulong uVar957;
  ulong uVar958;
  ulong uVar959;
  ulong uVar960;
  ulong uVar961;
  ulong uVar962;
  ulong uVar963;
  uint64_t uVar964;
  uint64_t uVar965;
  uint64_t uVar966;
  uint64_t tmp3_5;
  uint64_t tmp3_6;
  secp256k1_fe i;
  uint64_t tmp3_8;
  secp256k1_fe t;
  secp256k1_fe h3;
  secp256k1_fe h;
  secp256k1_fe s1;
  secp256k1_fe s2;
  secp256k1_fe u2;
  secp256k1_fe u1;
  secp256k1_fe h2;
  secp256k1_fe i2;
  secp256k1_fe z12;
  secp256k1_fe z22;
  secp256k1_fe local_230;
  secp256k1_gej *local_208;
  secp256k1_fe *local_200;
  secp256k1_fe *local_1f8;
  secp256k1_fe local_198;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  long local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  long local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_a8;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  if (a->infinity == 0) {
    if (b->infinity == 0) {
      r->infinity = 0;
      local_200 = &b->z;
      uVar950 = local_200->n[0];
      uVar953 = (b->z).n[1];
      uVar955 = (b->z).n[2];
      uVar941 = (b->z).n[3];
      uVar942 = (b->z).n[4];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar950 * 2;
      auVar442._8_8_ = 0;
      auVar442._0_8_ = uVar941;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar953 * 2;
      auVar443._8_8_ = 0;
      auVar443._0_8_ = uVar955;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar942;
      auVar444._8_8_ = 0;
      auVar444._0_8_ = uVar942;
      uVar931 = SUB168(auVar4 * auVar444,0);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar931 & 0xfffffffffffff;
      auVar2 = auVar3 * auVar443 + auVar2 * auVar442 + auVar5 * ZEXT816(0x1000003d10);
      uVar948 = auVar2._0_8_;
      auVar818._8_8_ = 0;
      auVar818._0_8_ = uVar948 >> 0x34 | auVar2._8_8_ << 0xc;
      uVar942 = uVar942 * 2;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar950;
      auVar445._8_8_ = 0;
      auVar445._0_8_ = uVar942;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar953 * 2;
      auVar446._8_8_ = 0;
      auVar446._0_8_ = uVar941;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar955;
      auVar447._8_8_ = 0;
      auVar447._0_8_ = uVar955;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar931 >> 0x34 | SUB168(auVar4 * auVar444,8) << 0xc;
      auVar2 = auVar6 * auVar445 + auVar818 + auVar7 * auVar446 + auVar8 * auVar447 +
               auVar9 * ZEXT816(0x1000003d10);
      uVar931 = auVar2._0_8_;
      auVar819._8_8_ = 0;
      auVar819._0_8_ = uVar931 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar950;
      auVar448._8_8_ = 0;
      auVar448._0_8_ = uVar950;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar953;
      auVar449._8_8_ = 0;
      auVar449._0_8_ = uVar942;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar955 * 2;
      auVar450._8_8_ = 0;
      auVar450._0_8_ = uVar941;
      auVar2 = auVar11 * auVar449 + auVar819 + auVar12 * auVar450;
      uVar949 = auVar2._0_8_;
      auVar821._8_8_ = 0;
      auVar821._0_8_ = uVar949 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar451._8_8_ = 0;
      auVar451._0_8_ = (uVar949 & 0xfffffffffffff) << 4 | (uVar931 & 0xfffffffffffff) >> 0x30;
      auVar2 = auVar10 * auVar448 + ZEXT816(0x1000003d1) * auVar451;
      uVar949 = auVar2._0_8_;
      local_58 = uVar949 & 0xfffffffffffff;
      auVar820._8_8_ = 0;
      auVar820._0_8_ = uVar949 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar950 * 2;
      auVar452._8_8_ = 0;
      auVar452._0_8_ = uVar953;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar955;
      auVar453._8_8_ = 0;
      auVar453._0_8_ = uVar942;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar941;
      auVar454._8_8_ = 0;
      auVar454._0_8_ = uVar941;
      auVar3 = auVar14 * auVar453 + auVar821 + auVar15 * auVar454;
      uVar949 = auVar3._0_8_;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar949 & 0xfffffffffffff;
      auVar2 = auVar13 * auVar452 + auVar820 + auVar16 * ZEXT816(0x1000003d10);
      uVar952 = auVar2._0_8_;
      auVar823._8_8_ = 0;
      auVar823._0_8_ = uVar949 >> 0x34 | auVar3._8_8_ << 0xc;
      local_50 = uVar952 & 0xfffffffffffff;
      auVar822._8_8_ = 0;
      auVar822._0_8_ = uVar952 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar950 * 2;
      auVar455._8_8_ = 0;
      auVar455._0_8_ = uVar955;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar953;
      auVar456._8_8_ = 0;
      auVar456._0_8_ = uVar953;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar941;
      auVar457._8_8_ = 0;
      auVar457._0_8_ = uVar942;
      auVar823 = auVar19 * auVar457 + auVar823;
      uVar950 = auVar823._0_8_;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar950 & 0xfffffffffffff;
      auVar2 = auVar17 * auVar455 + auVar822 + auVar18 * auVar456 + auVar20 * ZEXT816(0x1000003d10);
      uVar953 = auVar2._0_8_;
      local_48 = uVar953 & 0xfffffffffffff;
      auVar824._8_8_ = 0;
      auVar824._0_8_ = (uVar953 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar948 & 0xfffffffffffff);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uVar950 >> 0x34 | auVar823._8_8_ << 0xc;
      auVar824 = auVar21 * ZEXT816(0x1000003d10) + auVar824;
      uVar950 = auVar824._0_8_;
      local_40 = uVar950 & 0xfffffffffffff;
      local_38 = (uVar950 >> 0x34 | auVar824._8_8_ << 0xc) + (uVar931 & 0xffffffffffff);
      local_1f8 = &a->z;
      uVar950 = local_1f8->n[0];
      uVar953 = (a->z).n[1];
      uVar955 = (a->z).n[2];
      uVar941 = (a->z).n[3];
      uVar942 = (a->z).n[4];
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar950 * 2;
      auVar458._8_8_ = 0;
      auVar458._0_8_ = uVar941;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar953 * 2;
      auVar459._8_8_ = 0;
      auVar459._0_8_ = uVar955;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar942;
      auVar460._8_8_ = 0;
      auVar460._0_8_ = uVar942;
      uVar931 = SUB168(auVar24 * auVar460,0);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar931 & 0xfffffffffffff;
      auVar2 = auVar23 * auVar459 + auVar22 * auVar458 + auVar25 * ZEXT816(0x1000003d10);
      uVar948 = auVar2._0_8_;
      auVar825._8_8_ = 0;
      auVar825._0_8_ = uVar948 >> 0x34 | auVar2._8_8_ << 0xc;
      uVar942 = uVar942 * 2;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = uVar950;
      auVar461._8_8_ = 0;
      auVar461._0_8_ = uVar942;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uVar953 * 2;
      auVar462._8_8_ = 0;
      auVar462._0_8_ = uVar941;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar955;
      auVar463._8_8_ = 0;
      auVar463._0_8_ = uVar955;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uVar931 >> 0x34 | SUB168(auVar24 * auVar460,8) << 0xc;
      auVar2 = auVar26 * auVar461 + auVar825 + auVar27 * auVar462 + auVar28 * auVar463 +
               auVar29 * ZEXT816(0x1000003d10);
      uVar931 = auVar2._0_8_;
      auVar826._8_8_ = 0;
      auVar826._0_8_ = uVar931 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uVar950;
      auVar464._8_8_ = 0;
      auVar464._0_8_ = uVar950;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uVar953;
      auVar465._8_8_ = 0;
      auVar465._0_8_ = uVar942;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = uVar955 * 2;
      auVar466._8_8_ = 0;
      auVar466._0_8_ = uVar941;
      auVar2 = auVar31 * auVar465 + auVar826 + auVar32 * auVar466;
      uVar949 = auVar2._0_8_;
      auVar828._8_8_ = 0;
      auVar828._0_8_ = uVar949 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar467._8_8_ = 0;
      auVar467._0_8_ = (uVar949 & 0xfffffffffffff) << 4 | (uVar931 & 0xfffffffffffff) >> 0x30;
      auVar2 = auVar30 * auVar464 + ZEXT816(0x1000003d1) * auVar467;
      uVar949 = auVar2._0_8_;
      local_80 = uVar949 & 0xfffffffffffff;
      auVar827._8_8_ = 0;
      auVar827._0_8_ = uVar949 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = uVar950 * 2;
      auVar468._8_8_ = 0;
      auVar468._0_8_ = uVar953;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = uVar955;
      auVar469._8_8_ = 0;
      auVar469._0_8_ = uVar942;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = uVar941;
      auVar470._8_8_ = 0;
      auVar470._0_8_ = uVar941;
      auVar3 = auVar34 * auVar469 + auVar828 + auVar35 * auVar470;
      uVar949 = auVar3._0_8_;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = uVar949 & 0xfffffffffffff;
      auVar2 = auVar33 * auVar468 + auVar827 + auVar36 * ZEXT816(0x1000003d10);
      uVar952 = auVar2._0_8_;
      auVar830._8_8_ = 0;
      auVar830._0_8_ = uVar949 >> 0x34 | auVar3._8_8_ << 0xc;
      local_78 = uVar952 & 0xfffffffffffff;
      auVar829._8_8_ = 0;
      auVar829._0_8_ = uVar952 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar950 * 2;
      auVar471._8_8_ = 0;
      auVar471._0_8_ = uVar955;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar953;
      auVar472._8_8_ = 0;
      auVar472._0_8_ = uVar953;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uVar941;
      auVar473._8_8_ = 0;
      auVar473._0_8_ = uVar942;
      auVar830 = auVar39 * auVar473 + auVar830;
      uVar950 = auVar830._0_8_;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar950 & 0xfffffffffffff;
      auVar2 = auVar37 * auVar471 + auVar829 + auVar38 * auVar472 + auVar40 * ZEXT816(0x1000003d10);
      uVar953 = auVar2._0_8_;
      local_70 = uVar953 & 0xfffffffffffff;
      auVar831._8_8_ = 0;
      auVar831._0_8_ = (uVar953 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar948 & 0xfffffffffffff);
      auVar41._8_8_ = 0;
      auVar41._0_8_ = uVar950 >> 0x34 | auVar830._8_8_ << 0xc;
      auVar831 = auVar41 * ZEXT816(0x1000003d10) + auVar831;
      uVar950 = auVar831._0_8_;
      local_68 = uVar950 & 0xfffffffffffff;
      local_60 = (uVar950 >> 0x34 | auVar831._8_8_ << 0xc) + (uVar931 & 0xffffffffffff);
      uVar950 = (a->x).n[0];
      uVar953 = (a->x).n[1];
      uVar955 = (a->x).n[2];
      uVar941 = (a->x).n[3];
      uVar942 = (a->x).n[4];
      auVar42._8_8_ = 0;
      auVar42._0_8_ = local_58;
      auVar474._8_8_ = 0;
      auVar474._0_8_ = uVar941;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_50;
      auVar475._8_8_ = 0;
      auVar475._0_8_ = uVar955;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = local_48;
      auVar476._8_8_ = 0;
      auVar476._0_8_ = uVar953;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_40;
      auVar477._8_8_ = 0;
      auVar477._0_8_ = uVar950;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = local_38;
      auVar478._8_8_ = 0;
      auVar478._0_8_ = uVar942;
      uVar931 = SUB168(auVar46 * auVar478,0);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar931 & 0xfffffffffffff;
      auVar2 = auVar43 * auVar475 + auVar42 * auVar474 + auVar44 * auVar476 + auVar45 * auVar477 +
               auVar47 * ZEXT816(0x1000003d10);
      uVar948 = auVar2._0_8_;
      auVar832._8_8_ = 0;
      auVar832._0_8_ = uVar948 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = local_58;
      auVar479._8_8_ = 0;
      auVar479._0_8_ = uVar942;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = local_50;
      auVar480._8_8_ = 0;
      auVar480._0_8_ = uVar941;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = local_48;
      auVar481._8_8_ = 0;
      auVar481._0_8_ = uVar955;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = local_40;
      auVar482._8_8_ = 0;
      auVar482._0_8_ = uVar953;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = local_38;
      auVar483._8_8_ = 0;
      auVar483._0_8_ = uVar950;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = uVar931 >> 0x34 | SUB168(auVar46 * auVar478,8) << 0xc;
      auVar2 = auVar48 * auVar479 + auVar832 + auVar49 * auVar480 + auVar50 * auVar481 +
               auVar51 * auVar482 + auVar52 * auVar483 + auVar53 * ZEXT816(0x1000003d10);
      uVar931 = auVar2._0_8_;
      auVar833._8_8_ = 0;
      auVar833._0_8_ = uVar931 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = local_58;
      auVar484._8_8_ = 0;
      auVar484._0_8_ = uVar950;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = local_50;
      auVar485._8_8_ = 0;
      auVar485._0_8_ = uVar942;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = local_48;
      auVar486._8_8_ = 0;
      auVar486._0_8_ = uVar941;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = local_40;
      auVar487._8_8_ = 0;
      auVar487._0_8_ = uVar955;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = local_38;
      auVar488._8_8_ = 0;
      auVar488._0_8_ = uVar953;
      auVar2 = auVar55 * auVar485 + auVar833 + auVar56 * auVar486 + auVar57 * auVar487 +
               auVar58 * auVar488;
      uVar949 = auVar2._0_8_;
      auVar835._8_8_ = 0;
      auVar835._0_8_ = uVar949 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar489._8_8_ = 0;
      auVar489._0_8_ = (uVar949 & 0xfffffffffffff) << 4 | (uVar931 & 0xfffffffffffff) >> 0x30;
      auVar2 = auVar54 * auVar484 + ZEXT816(0x1000003d1) * auVar489;
      uVar949 = auVar2._0_8_;
      local_f8 = uVar949 & 0xfffffffffffff;
      auVar834._8_8_ = 0;
      auVar834._0_8_ = uVar949 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = local_58;
      auVar490._8_8_ = 0;
      auVar490._0_8_ = uVar953;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = local_50;
      auVar491._8_8_ = 0;
      auVar491._0_8_ = uVar950;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = local_48;
      auVar492._8_8_ = 0;
      auVar492._0_8_ = uVar942;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = local_40;
      auVar493._8_8_ = 0;
      auVar493._0_8_ = uVar941;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = local_38;
      auVar494._8_8_ = 0;
      auVar494._0_8_ = uVar955;
      auVar3 = auVar61 * auVar492 + auVar835 + auVar62 * auVar493 + auVar63 * auVar494;
      uVar949 = auVar3._0_8_;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = uVar949 & 0xfffffffffffff;
      auVar2 = auVar59 * auVar490 + auVar834 + auVar60 * auVar491 + auVar64 * ZEXT816(0x1000003d10);
      uVar952 = auVar2._0_8_;
      auVar837._8_8_ = 0;
      auVar837._0_8_ = uVar949 >> 0x34 | auVar3._8_8_ << 0xc;
      local_f0 = uVar952 & 0xfffffffffffff;
      auVar836._8_8_ = 0;
      auVar836._0_8_ = uVar952 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = local_58;
      auVar495._8_8_ = 0;
      auVar495._0_8_ = uVar955;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = local_50;
      auVar496._8_8_ = 0;
      auVar496._0_8_ = uVar953;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = local_48;
      auVar497._8_8_ = 0;
      auVar497._0_8_ = uVar950;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = local_40;
      auVar498._8_8_ = 0;
      auVar498._0_8_ = uVar942;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = local_38;
      auVar499._8_8_ = 0;
      auVar499._0_8_ = uVar941;
      auVar3 = auVar68 * auVar498 + auVar837 + auVar69 * auVar499;
      uVar950 = auVar3._0_8_;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = uVar950 & 0xfffffffffffff;
      auVar2 = auVar65 * auVar495 + auVar836 + auVar66 * auVar496 + auVar67 * auVar497 +
               auVar70 * ZEXT816(0x1000003d10);
      uVar953 = auVar2._0_8_;
      local_e8 = uVar953 & 0xfffffffffffff;
      auVar838._8_8_ = 0;
      auVar838._0_8_ = (uVar953 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar948 & 0xfffffffffffff);
      auVar71._8_8_ = 0;
      auVar71._0_8_ = uVar950 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar838 = auVar71 * ZEXT816(0x1000003d10) + auVar838;
      uVar950 = auVar838._0_8_;
      local_e0 = uVar950 & 0xfffffffffffff;
      local_d8 = (uVar950 >> 0x34 | auVar838._8_8_ << 0xc) + (uVar931 & 0xffffffffffff);
      uVar950 = (b->x).n[0];
      uVar953 = (b->x).n[1];
      uVar955 = (b->x).n[2];
      uVar941 = (b->x).n[3];
      uVar942 = (b->x).n[4];
      auVar72._8_8_ = 0;
      auVar72._0_8_ = local_80;
      auVar500._8_8_ = 0;
      auVar500._0_8_ = uVar941;
      auVar73._8_8_ = 0;
      auVar73._0_8_ = local_78;
      auVar501._8_8_ = 0;
      auVar501._0_8_ = uVar955;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = local_70;
      auVar502._8_8_ = 0;
      auVar502._0_8_ = uVar953;
      auVar75._8_8_ = 0;
      auVar75._0_8_ = local_68;
      auVar503._8_8_ = 0;
      auVar503._0_8_ = uVar950;
      auVar76._8_8_ = 0;
      auVar76._0_8_ = local_60;
      auVar504._8_8_ = 0;
      auVar504._0_8_ = uVar942;
      uVar931 = SUB168(auVar76 * auVar504,0);
      auVar77._8_8_ = 0;
      auVar77._0_8_ = uVar931 & 0xfffffffffffff;
      auVar2 = auVar73 * auVar501 + auVar72 * auVar500 + auVar74 * auVar502 + auVar75 * auVar503 +
               auVar77 * ZEXT816(0x1000003d10);
      uVar948 = auVar2._0_8_;
      auVar839._8_8_ = 0;
      auVar839._0_8_ = uVar948 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = local_80;
      auVar505._8_8_ = 0;
      auVar505._0_8_ = uVar942;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = local_78;
      auVar506._8_8_ = 0;
      auVar506._0_8_ = uVar941;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = local_70;
      auVar507._8_8_ = 0;
      auVar507._0_8_ = uVar955;
      auVar81._8_8_ = 0;
      auVar81._0_8_ = local_68;
      auVar508._8_8_ = 0;
      auVar508._0_8_ = uVar953;
      auVar82._8_8_ = 0;
      auVar82._0_8_ = local_60;
      auVar509._8_8_ = 0;
      auVar509._0_8_ = uVar950;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = uVar931 >> 0x34 | SUB168(auVar76 * auVar504,8) << 0xc;
      auVar2 = auVar78 * auVar505 + auVar839 + auVar79 * auVar506 + auVar80 * auVar507 +
               auVar81 * auVar508 + auVar82 * auVar509 + auVar83 * ZEXT816(0x1000003d10);
      uVar931 = auVar2._0_8_;
      auVar840._8_8_ = 0;
      auVar840._0_8_ = uVar931 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = local_80;
      auVar510._8_8_ = 0;
      auVar510._0_8_ = uVar950;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = local_78;
      auVar511._8_8_ = 0;
      auVar511._0_8_ = uVar942;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = local_70;
      auVar512._8_8_ = 0;
      auVar512._0_8_ = uVar941;
      auVar87._8_8_ = 0;
      auVar87._0_8_ = local_68;
      auVar513._8_8_ = 0;
      auVar513._0_8_ = uVar955;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = local_60;
      auVar514._8_8_ = 0;
      auVar514._0_8_ = uVar953;
      auVar2 = auVar85 * auVar511 + auVar840 + auVar86 * auVar512 + auVar87 * auVar513 +
               auVar88 * auVar514;
      uVar949 = auVar2._0_8_;
      auVar842._8_8_ = 0;
      auVar842._0_8_ = uVar949 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar515._8_8_ = 0;
      auVar515._0_8_ = (uVar949 & 0xfffffffffffff) << 4 | (uVar931 & 0xfffffffffffff) >> 0x30;
      auVar2 = auVar84 * auVar510 + ZEXT816(0x1000003d1) * auVar515;
      uVar949 = auVar2._0_8_;
      local_120 = uVar949 & 0xfffffffffffff;
      auVar841._8_8_ = 0;
      auVar841._0_8_ = uVar949 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar89._8_8_ = 0;
      auVar89._0_8_ = local_80;
      auVar516._8_8_ = 0;
      auVar516._0_8_ = uVar953;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = local_78;
      auVar517._8_8_ = 0;
      auVar517._0_8_ = uVar950;
      auVar91._8_8_ = 0;
      auVar91._0_8_ = local_70;
      auVar518._8_8_ = 0;
      auVar518._0_8_ = uVar942;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = local_68;
      auVar519._8_8_ = 0;
      auVar519._0_8_ = uVar941;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = local_60;
      auVar520._8_8_ = 0;
      auVar520._0_8_ = uVar955;
      auVar3 = auVar91 * auVar518 + auVar842 + auVar92 * auVar519 + auVar93 * auVar520;
      uVar949 = auVar3._0_8_;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = uVar949 & 0xfffffffffffff;
      auVar2 = auVar89 * auVar516 + auVar841 + auVar90 * auVar517 + auVar94 * ZEXT816(0x1000003d10);
      uVar952 = auVar2._0_8_;
      auVar844._8_8_ = 0;
      auVar844._0_8_ = uVar949 >> 0x34 | auVar3._8_8_ << 0xc;
      local_118 = uVar952 & 0xfffffffffffff;
      auVar843._8_8_ = 0;
      auVar843._0_8_ = uVar952 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = local_80;
      auVar521._8_8_ = 0;
      auVar521._0_8_ = uVar955;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = local_78;
      auVar522._8_8_ = 0;
      auVar522._0_8_ = uVar953;
      auVar97._8_8_ = 0;
      auVar97._0_8_ = local_70;
      auVar523._8_8_ = 0;
      auVar523._0_8_ = uVar950;
      auVar98._8_8_ = 0;
      auVar98._0_8_ = local_68;
      auVar524._8_8_ = 0;
      auVar524._0_8_ = uVar942;
      auVar99._8_8_ = 0;
      auVar99._0_8_ = local_60;
      auVar525._8_8_ = 0;
      auVar525._0_8_ = uVar941;
      auVar3 = auVar98 * auVar524 + auVar844 + auVar99 * auVar525;
      uVar950 = auVar3._0_8_;
      auVar100._8_8_ = 0;
      auVar100._0_8_ = uVar950 & 0xfffffffffffff;
      auVar2 = auVar95 * auVar521 + auVar843 + auVar96 * auVar522 + auVar97 * auVar523 +
               auVar100 * ZEXT816(0x1000003d10);
      uVar953 = auVar2._0_8_;
      local_110 = uVar953 & 0xfffffffffffff;
      auVar845._8_8_ = 0;
      auVar845._0_8_ = (uVar953 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar948 & 0xfffffffffffff);
      auVar101._8_8_ = 0;
      auVar101._0_8_ = uVar950 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar845 = auVar101 * ZEXT816(0x1000003d10) + auVar845;
      uVar950 = auVar845._0_8_;
      local_108 = uVar950 & 0xfffffffffffff;
      local_100 = (uVar950 >> 0x34 | auVar845._8_8_ << 0xc) + (uVar931 & 0xffffffffffff);
      uVar950 = (a->y).n[0];
      uVar953 = (a->y).n[1];
      uVar955 = (a->y).n[2];
      uVar941 = (a->y).n[3];
      uVar942 = (a->y).n[4];
      auVar102._8_8_ = 0;
      auVar102._0_8_ = local_58;
      auVar526._8_8_ = 0;
      auVar526._0_8_ = uVar941;
      auVar103._8_8_ = 0;
      auVar103._0_8_ = local_50;
      auVar527._8_8_ = 0;
      auVar527._0_8_ = uVar955;
      auVar104._8_8_ = 0;
      auVar104._0_8_ = local_48;
      auVar528._8_8_ = 0;
      auVar528._0_8_ = uVar953;
      auVar105._8_8_ = 0;
      auVar105._0_8_ = local_40;
      auVar529._8_8_ = 0;
      auVar529._0_8_ = uVar950;
      auVar106._8_8_ = 0;
      auVar106._0_8_ = local_38;
      auVar530._8_8_ = 0;
      auVar530._0_8_ = uVar942;
      uVar931 = SUB168(auVar106 * auVar530,0);
      auVar107._8_8_ = 0;
      auVar107._0_8_ = uVar931 & 0xfffffffffffff;
      auVar2 = auVar103 * auVar527 + auVar102 * auVar526 + auVar104 * auVar528 + auVar105 * auVar529
               + auVar107 * ZEXT816(0x1000003d10);
      uVar949 = auVar2._0_8_;
      auVar846._8_8_ = 0;
      auVar846._0_8_ = uVar949 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar108._8_8_ = 0;
      auVar108._0_8_ = local_58;
      auVar531._8_8_ = 0;
      auVar531._0_8_ = uVar942;
      auVar109._8_8_ = 0;
      auVar109._0_8_ = local_50;
      auVar532._8_8_ = 0;
      auVar532._0_8_ = uVar941;
      auVar110._8_8_ = 0;
      auVar110._0_8_ = local_48;
      auVar533._8_8_ = 0;
      auVar533._0_8_ = uVar955;
      auVar111._8_8_ = 0;
      auVar111._0_8_ = local_40;
      auVar534._8_8_ = 0;
      auVar534._0_8_ = uVar953;
      auVar112._8_8_ = 0;
      auVar112._0_8_ = local_38;
      auVar535._8_8_ = 0;
      auVar535._0_8_ = uVar950;
      auVar113._8_8_ = 0;
      auVar113._0_8_ = uVar931 >> 0x34 | SUB168(auVar106 * auVar530,8) << 0xc;
      auVar2 = auVar108 * auVar531 + auVar846 + auVar109 * auVar532 + auVar110 * auVar533 +
               auVar111 * auVar534 + auVar112 * auVar535 + auVar113 * ZEXT816(0x1000003d10);
      uVar952 = auVar2._0_8_;
      auVar847._8_8_ = 0;
      auVar847._0_8_ = uVar952 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar114._8_8_ = 0;
      auVar114._0_8_ = local_58;
      auVar536._8_8_ = 0;
      auVar536._0_8_ = uVar950;
      auVar115._8_8_ = 0;
      auVar115._0_8_ = local_50;
      auVar537._8_8_ = 0;
      auVar537._0_8_ = uVar942;
      auVar116._8_8_ = 0;
      auVar116._0_8_ = local_48;
      auVar538._8_8_ = 0;
      auVar538._0_8_ = uVar941;
      auVar117._8_8_ = 0;
      auVar117._0_8_ = local_40;
      auVar539._8_8_ = 0;
      auVar539._0_8_ = uVar955;
      auVar118._8_8_ = 0;
      auVar118._0_8_ = local_38;
      auVar540._8_8_ = 0;
      auVar540._0_8_ = uVar953;
      auVar2 = auVar115 * auVar537 + auVar847 + auVar116 * auVar538 + auVar117 * auVar539 +
               auVar118 * auVar540;
      uVar931 = auVar2._0_8_;
      auVar849._8_8_ = 0;
      auVar849._0_8_ = uVar931 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar541._8_8_ = 0;
      auVar541._0_8_ = (uVar931 & 0xfffffffffffff) << 4 | (uVar952 & 0xfffffffffffff) >> 0x30;
      auVar2 = auVar114 * auVar536 + ZEXT816(0x1000003d1) * auVar541;
      uVar948 = auVar2._0_8_;
      uVar931 = uVar948 & 0xfffffffffffff;
      auVar848._8_8_ = 0;
      auVar848._0_8_ = uVar948 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar119._8_8_ = 0;
      auVar119._0_8_ = local_58;
      auVar542._8_8_ = 0;
      auVar542._0_8_ = uVar953;
      auVar120._8_8_ = 0;
      auVar120._0_8_ = local_50;
      auVar543._8_8_ = 0;
      auVar543._0_8_ = uVar950;
      auVar121._8_8_ = 0;
      auVar121._0_8_ = local_48;
      auVar544._8_8_ = 0;
      auVar544._0_8_ = uVar942;
      auVar122._8_8_ = 0;
      auVar122._0_8_ = local_40;
      auVar545._8_8_ = 0;
      auVar545._0_8_ = uVar941;
      auVar123._8_8_ = 0;
      auVar123._0_8_ = local_38;
      auVar546._8_8_ = 0;
      auVar546._0_8_ = uVar955;
      auVar3 = auVar121 * auVar544 + auVar849 + auVar122 * auVar545 + auVar123 * auVar546;
      uVar948 = auVar3._0_8_;
      auVar124._8_8_ = 0;
      auVar124._0_8_ = uVar948 & 0xfffffffffffff;
      auVar2 = auVar119 * auVar542 + auVar848 + auVar120 * auVar543 +
               auVar124 * ZEXT816(0x1000003d10);
      uVar954 = auVar2._0_8_;
      auVar851._8_8_ = 0;
      auVar851._0_8_ = uVar948 >> 0x34 | auVar3._8_8_ << 0xc;
      uVar948 = uVar954 & 0xfffffffffffff;
      auVar850._8_8_ = 0;
      auVar850._0_8_ = uVar954 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar125._8_8_ = 0;
      auVar125._0_8_ = local_58;
      auVar547._8_8_ = 0;
      auVar547._0_8_ = uVar955;
      auVar126._8_8_ = 0;
      auVar126._0_8_ = local_50;
      auVar548._8_8_ = 0;
      auVar548._0_8_ = uVar953;
      auVar127._8_8_ = 0;
      auVar127._0_8_ = local_48;
      auVar549._8_8_ = 0;
      auVar549._0_8_ = uVar950;
      auVar128._8_8_ = 0;
      auVar128._0_8_ = local_40;
      auVar550._8_8_ = 0;
      auVar550._0_8_ = uVar942;
      auVar129._8_8_ = 0;
      auVar129._0_8_ = local_38;
      auVar551._8_8_ = 0;
      auVar551._0_8_ = uVar941;
      auVar3 = auVar128 * auVar550 + auVar851 + auVar129 * auVar551;
      uVar953 = auVar3._0_8_;
      auVar130._8_8_ = 0;
      auVar130._0_8_ = uVar953 & 0xfffffffffffff;
      auVar2 = auVar125 * auVar547 + auVar850 + auVar126 * auVar548 + auVar127 * auVar549 +
               auVar130 * ZEXT816(0x1000003d10);
      uVar955 = auVar2._0_8_;
      uVar950 = uVar955 & 0xfffffffffffff;
      auVar852._8_8_ = 0;
      auVar852._0_8_ = (uVar955 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar949 & 0xfffffffffffff);
      auVar131._8_8_ = 0;
      auVar131._0_8_ = uVar953 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar852 = auVar131 * ZEXT816(0x1000003d10) + auVar852;
      uVar955 = auVar852._0_8_;
      uVar953 = uVar955 & 0xfffffffffffff;
      uVar949 = (uVar955 >> 0x34 | auVar852._8_8_ << 0xc) + (uVar952 & 0xffffffffffff);
      auVar132._8_8_ = 0;
      auVar132._0_8_ = local_200->n[0];
      auVar552._8_8_ = 0;
      auVar552._0_8_ = uVar953;
      auVar133._8_8_ = 0;
      auVar133._0_8_ = (b->z).n[1];
      auVar553._8_8_ = 0;
      auVar553._0_8_ = uVar950;
      auVar134._8_8_ = 0;
      auVar134._0_8_ = (b->z).n[2];
      auVar554._8_8_ = 0;
      auVar554._0_8_ = uVar948;
      auVar135._8_8_ = 0;
      auVar135._0_8_ = (b->z).n[3];
      auVar555._8_8_ = 0;
      auVar555._0_8_ = uVar931;
      auVar136._8_8_ = 0;
      auVar136._0_8_ = (b->z).n[4];
      auVar556._8_8_ = 0;
      auVar556._0_8_ = uVar949;
      uVar955 = SUB168(auVar136 * auVar556,0);
      auVar137._8_8_ = 0;
      auVar137._0_8_ = uVar955 & 0xfffffffffffff;
      auVar2 = auVar133 * auVar553 + auVar132 * auVar552 + auVar134 * auVar554 + auVar135 * auVar555
               + auVar137 * ZEXT816(0x1000003d10);
      uVar941 = auVar2._0_8_;
      auVar853._8_8_ = 0;
      auVar853._0_8_ = uVar941 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar138._8_8_ = 0;
      auVar138._0_8_ = local_200->n[0];
      auVar557._8_8_ = 0;
      auVar557._0_8_ = uVar949;
      auVar139._8_8_ = 0;
      auVar139._0_8_ = (b->z).n[1];
      auVar558._8_8_ = 0;
      auVar558._0_8_ = uVar953;
      auVar140._8_8_ = 0;
      auVar140._0_8_ = (b->z).n[2];
      auVar559._8_8_ = 0;
      auVar559._0_8_ = uVar950;
      auVar141._8_8_ = 0;
      auVar141._0_8_ = (b->z).n[3];
      auVar560._8_8_ = 0;
      auVar560._0_8_ = uVar948;
      auVar142._8_8_ = 0;
      auVar142._0_8_ = (b->z).n[4];
      auVar561._8_8_ = 0;
      auVar561._0_8_ = uVar931;
      auVar143._8_8_ = 0;
      auVar143._0_8_ = uVar955 >> 0x34 | SUB168(auVar136 * auVar556,8) << 0xc;
      auVar2 = auVar138 * auVar557 + auVar853 + auVar139 * auVar558 + auVar140 * auVar559 +
               auVar141 * auVar560 + auVar142 * auVar561 + auVar143 * ZEXT816(0x1000003d10);
      uVar955 = auVar2._0_8_;
      auVar854._8_8_ = 0;
      auVar854._0_8_ = uVar955 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar144._8_8_ = 0;
      auVar144._0_8_ = local_200->n[0];
      auVar562._8_8_ = 0;
      auVar562._0_8_ = uVar931;
      auVar145._8_8_ = 0;
      auVar145._0_8_ = (b->z).n[1];
      auVar563._8_8_ = 0;
      auVar563._0_8_ = uVar949;
      auVar146._8_8_ = 0;
      auVar146._0_8_ = (b->z).n[2];
      auVar564._8_8_ = 0;
      auVar564._0_8_ = uVar953;
      auVar147._8_8_ = 0;
      auVar147._0_8_ = (b->z).n[3];
      auVar565._8_8_ = 0;
      auVar565._0_8_ = uVar950;
      auVar148._8_8_ = 0;
      auVar148._0_8_ = (b->z).n[4];
      auVar566._8_8_ = 0;
      auVar566._0_8_ = uVar948;
      auVar2 = auVar145 * auVar563 + auVar854 + auVar146 * auVar564 + auVar147 * auVar565 +
               auVar148 * auVar566;
      uVar942 = auVar2._0_8_;
      auVar856._8_8_ = 0;
      auVar856._0_8_ = uVar942 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar567._8_8_ = 0;
      auVar567._0_8_ = (uVar942 & 0xfffffffffffff) << 4 | (uVar955 & 0xfffffffffffff) >> 0x30;
      auVar2 = auVar144 * auVar562 + ZEXT816(0x1000003d1) * auVar567;
      uVar942 = auVar2._0_8_;
      local_170 = uVar942 & 0xfffffffffffff;
      auVar855._8_8_ = 0;
      auVar855._0_8_ = uVar942 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar149._8_8_ = 0;
      auVar149._0_8_ = local_200->n[0];
      auVar568._8_8_ = 0;
      auVar568._0_8_ = uVar948;
      auVar150._8_8_ = 0;
      auVar150._0_8_ = (b->z).n[1];
      auVar569._8_8_ = 0;
      auVar569._0_8_ = uVar931;
      auVar151._8_8_ = 0;
      auVar151._0_8_ = (b->z).n[2];
      auVar570._8_8_ = 0;
      auVar570._0_8_ = uVar949;
      auVar152._8_8_ = 0;
      auVar152._0_8_ = (b->z).n[3];
      auVar571._8_8_ = 0;
      auVar571._0_8_ = uVar953;
      auVar153._8_8_ = 0;
      auVar153._0_8_ = (b->z).n[4];
      auVar572._8_8_ = 0;
      auVar572._0_8_ = uVar950;
      auVar3 = auVar151 * auVar570 + auVar856 + auVar152 * auVar571 + auVar153 * auVar572;
      uVar942 = auVar3._0_8_;
      auVar154._8_8_ = 0;
      auVar154._0_8_ = uVar942 & 0xfffffffffffff;
      auVar2 = auVar149 * auVar568 + auVar855 + auVar150 * auVar569 +
               auVar154 * ZEXT816(0x1000003d10);
      uVar952 = auVar2._0_8_;
      auVar858._8_8_ = 0;
      auVar858._0_8_ = uVar942 >> 0x34 | auVar3._8_8_ << 0xc;
      local_168 = uVar952 & 0xfffffffffffff;
      auVar857._8_8_ = 0;
      auVar857._0_8_ = uVar952 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar155._8_8_ = 0;
      auVar155._0_8_ = local_200->n[0];
      auVar573._8_8_ = 0;
      auVar573._0_8_ = uVar950;
      auVar156._8_8_ = 0;
      auVar156._0_8_ = (b->z).n[1];
      auVar574._8_8_ = 0;
      auVar574._0_8_ = uVar948;
      auVar157._8_8_ = 0;
      auVar157._0_8_ = (b->z).n[2];
      auVar575._8_8_ = 0;
      auVar575._0_8_ = uVar931;
      auVar158._8_8_ = 0;
      auVar158._0_8_ = (b->z).n[3];
      auVar576._8_8_ = 0;
      auVar576._0_8_ = uVar949;
      auVar159._8_8_ = 0;
      auVar159._0_8_ = (b->z).n[4];
      auVar577._8_8_ = 0;
      auVar577._0_8_ = uVar953;
      auVar3 = auVar158 * auVar576 + auVar858 + auVar159 * auVar577;
      uVar950 = auVar3._0_8_;
      auVar160._8_8_ = 0;
      auVar160._0_8_ = uVar950 & 0xfffffffffffff;
      auVar2 = auVar155 * auVar573 + auVar857 + auVar156 * auVar574 + auVar157 * auVar575 +
               auVar160 * ZEXT816(0x1000003d10);
      uVar953 = auVar2._0_8_;
      local_160 = uVar953 & 0xfffffffffffff;
      auVar859._8_8_ = 0;
      auVar859._0_8_ = (uVar953 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar941 & 0xfffffffffffff);
      auVar161._8_8_ = 0;
      auVar161._0_8_ = uVar950 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar859 = auVar161 * ZEXT816(0x1000003d10) + auVar859;
      uVar950 = auVar859._0_8_;
      local_158 = uVar950 & 0xfffffffffffff;
      local_150 = (uVar950 >> 0x34 | auVar859._8_8_ << 0xc) + (uVar955 & 0xffffffffffff);
      uVar950 = (b->y).n[0];
      uVar953 = (b->y).n[1];
      uVar955 = (b->y).n[2];
      uVar941 = (b->y).n[3];
      uVar942 = (b->y).n[4];
      auVar162._8_8_ = 0;
      auVar162._0_8_ = local_80;
      auVar578._8_8_ = 0;
      auVar578._0_8_ = uVar941;
      auVar163._8_8_ = 0;
      auVar163._0_8_ = local_78;
      auVar579._8_8_ = 0;
      auVar579._0_8_ = uVar955;
      auVar164._8_8_ = 0;
      auVar164._0_8_ = local_70;
      auVar580._8_8_ = 0;
      auVar580._0_8_ = uVar953;
      auVar165._8_8_ = 0;
      auVar165._0_8_ = local_68;
      auVar581._8_8_ = 0;
      auVar581._0_8_ = uVar950;
      auVar166._8_8_ = 0;
      auVar166._0_8_ = local_60;
      auVar582._8_8_ = 0;
      auVar582._0_8_ = uVar942;
      uVar931 = SUB168(auVar166 * auVar582,0);
      auVar167._8_8_ = 0;
      auVar167._0_8_ = uVar931 & 0xfffffffffffff;
      auVar2 = auVar163 * auVar579 + auVar162 * auVar578 + auVar164 * auVar580 + auVar165 * auVar581
               + auVar167 * ZEXT816(0x1000003d10);
      uVar949 = auVar2._0_8_;
      auVar860._8_8_ = 0;
      auVar860._0_8_ = uVar949 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar168._8_8_ = 0;
      auVar168._0_8_ = local_80;
      auVar583._8_8_ = 0;
      auVar583._0_8_ = uVar942;
      auVar169._8_8_ = 0;
      auVar169._0_8_ = local_78;
      auVar584._8_8_ = 0;
      auVar584._0_8_ = uVar941;
      auVar170._8_8_ = 0;
      auVar170._0_8_ = local_70;
      auVar585._8_8_ = 0;
      auVar585._0_8_ = uVar955;
      auVar171._8_8_ = 0;
      auVar171._0_8_ = local_68;
      auVar586._8_8_ = 0;
      auVar586._0_8_ = uVar953;
      auVar172._8_8_ = 0;
      auVar172._0_8_ = local_60;
      auVar587._8_8_ = 0;
      auVar587._0_8_ = uVar950;
      auVar173._8_8_ = 0;
      auVar173._0_8_ = uVar931 >> 0x34 | SUB168(auVar166 * auVar582,8) << 0xc;
      auVar2 = auVar168 * auVar583 + auVar860 + auVar169 * auVar584 + auVar170 * auVar585 +
               auVar171 * auVar586 + auVar172 * auVar587 + auVar173 * ZEXT816(0x1000003d10);
      uVar952 = auVar2._0_8_;
      auVar861._8_8_ = 0;
      auVar861._0_8_ = uVar952 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar174._8_8_ = 0;
      auVar174._0_8_ = local_80;
      auVar588._8_8_ = 0;
      auVar588._0_8_ = uVar950;
      auVar175._8_8_ = 0;
      auVar175._0_8_ = local_78;
      auVar589._8_8_ = 0;
      auVar589._0_8_ = uVar942;
      auVar176._8_8_ = 0;
      auVar176._0_8_ = local_70;
      auVar590._8_8_ = 0;
      auVar590._0_8_ = uVar941;
      auVar177._8_8_ = 0;
      auVar177._0_8_ = local_68;
      auVar591._8_8_ = 0;
      auVar591._0_8_ = uVar955;
      auVar178._8_8_ = 0;
      auVar178._0_8_ = local_60;
      auVar592._8_8_ = 0;
      auVar592._0_8_ = uVar953;
      auVar2 = auVar175 * auVar589 + auVar861 + auVar176 * auVar590 + auVar177 * auVar591 +
               auVar178 * auVar592;
      uVar931 = auVar2._0_8_;
      auVar863._8_8_ = 0;
      auVar863._0_8_ = uVar931 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar593._8_8_ = 0;
      auVar593._0_8_ = (uVar931 & 0xfffffffffffff) << 4 | (uVar952 & 0xfffffffffffff) >> 0x30;
      auVar2 = auVar174 * auVar588 + ZEXT816(0x1000003d1) * auVar593;
      uVar948 = auVar2._0_8_;
      uVar931 = uVar948 & 0xfffffffffffff;
      auVar862._8_8_ = 0;
      auVar862._0_8_ = uVar948 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar179._8_8_ = 0;
      auVar179._0_8_ = local_80;
      auVar594._8_8_ = 0;
      auVar594._0_8_ = uVar953;
      auVar180._8_8_ = 0;
      auVar180._0_8_ = local_78;
      auVar595._8_8_ = 0;
      auVar595._0_8_ = uVar950;
      auVar181._8_8_ = 0;
      auVar181._0_8_ = local_70;
      auVar596._8_8_ = 0;
      auVar596._0_8_ = uVar942;
      auVar182._8_8_ = 0;
      auVar182._0_8_ = local_68;
      auVar597._8_8_ = 0;
      auVar597._0_8_ = uVar941;
      auVar183._8_8_ = 0;
      auVar183._0_8_ = local_60;
      auVar598._8_8_ = 0;
      auVar598._0_8_ = uVar955;
      auVar3 = auVar181 * auVar596 + auVar863 + auVar182 * auVar597 + auVar183 * auVar598;
      uVar948 = auVar3._0_8_;
      auVar184._8_8_ = 0;
      auVar184._0_8_ = uVar948 & 0xfffffffffffff;
      auVar2 = auVar179 * auVar594 + auVar862 + auVar180 * auVar595 +
               auVar184 * ZEXT816(0x1000003d10);
      uVar954 = auVar2._0_8_;
      auVar865._8_8_ = 0;
      auVar865._0_8_ = uVar948 >> 0x34 | auVar3._8_8_ << 0xc;
      uVar948 = uVar954 & 0xfffffffffffff;
      auVar864._8_8_ = 0;
      auVar864._0_8_ = uVar954 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar185._8_8_ = 0;
      auVar185._0_8_ = local_80;
      auVar599._8_8_ = 0;
      auVar599._0_8_ = uVar955;
      auVar186._8_8_ = 0;
      auVar186._0_8_ = local_78;
      auVar600._8_8_ = 0;
      auVar600._0_8_ = uVar953;
      auVar187._8_8_ = 0;
      auVar187._0_8_ = local_70;
      auVar601._8_8_ = 0;
      auVar601._0_8_ = uVar950;
      auVar188._8_8_ = 0;
      auVar188._0_8_ = local_68;
      auVar602._8_8_ = 0;
      auVar602._0_8_ = uVar942;
      auVar189._8_8_ = 0;
      auVar189._0_8_ = local_60;
      auVar603._8_8_ = 0;
      auVar603._0_8_ = uVar941;
      auVar3 = auVar188 * auVar602 + auVar865 + auVar189 * auVar603;
      uVar953 = auVar3._0_8_;
      auVar190._8_8_ = 0;
      auVar190._0_8_ = uVar953 & 0xfffffffffffff;
      auVar2 = auVar185 * auVar599 + auVar864 + auVar186 * auVar600 + auVar187 * auVar601 +
               auVar190 * ZEXT816(0x1000003d10);
      uVar955 = auVar2._0_8_;
      uVar950 = uVar955 & 0xfffffffffffff;
      auVar866._8_8_ = 0;
      auVar866._0_8_ = (uVar955 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar949 & 0xfffffffffffff);
      auVar191._8_8_ = 0;
      auVar191._0_8_ = uVar953 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar866 = auVar191 * ZEXT816(0x1000003d10) + auVar866;
      uVar955 = auVar866._0_8_;
      uVar953 = uVar955 & 0xfffffffffffff;
      uVar949 = (uVar955 >> 0x34 | auVar866._8_8_ << 0xc) + (uVar952 & 0xffffffffffff);
      auVar192._8_8_ = 0;
      auVar192._0_8_ = local_1f8->n[0];
      auVar604._8_8_ = 0;
      auVar604._0_8_ = uVar953;
      auVar193._8_8_ = 0;
      auVar193._0_8_ = (a->z).n[1];
      auVar605._8_8_ = 0;
      auVar605._0_8_ = uVar950;
      auVar194._8_8_ = 0;
      auVar194._0_8_ = (a->z).n[2];
      auVar606._8_8_ = 0;
      auVar606._0_8_ = uVar948;
      auVar195._8_8_ = 0;
      auVar195._0_8_ = (a->z).n[3];
      auVar607._8_8_ = 0;
      auVar607._0_8_ = uVar931;
      auVar196._8_8_ = 0;
      auVar196._0_8_ = (a->z).n[4];
      auVar608._8_8_ = 0;
      auVar608._0_8_ = uVar949;
      uVar955 = SUB168(auVar196 * auVar608,0);
      auVar197._8_8_ = 0;
      auVar197._0_8_ = uVar955 & 0xfffffffffffff;
      auVar2 = auVar193 * auVar605 + auVar192 * auVar604 + auVar194 * auVar606 + auVar195 * auVar607
               + auVar197 * ZEXT816(0x1000003d10);
      uVar941 = auVar2._0_8_;
      auVar867._8_8_ = 0;
      auVar867._0_8_ = uVar941 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar198._8_8_ = 0;
      auVar198._0_8_ = local_1f8->n[0];
      auVar609._8_8_ = 0;
      auVar609._0_8_ = uVar949;
      auVar199._8_8_ = 0;
      auVar199._0_8_ = (a->z).n[1];
      auVar610._8_8_ = 0;
      auVar610._0_8_ = uVar953;
      auVar200._8_8_ = 0;
      auVar200._0_8_ = (a->z).n[2];
      auVar611._8_8_ = 0;
      auVar611._0_8_ = uVar950;
      auVar201._8_8_ = 0;
      auVar201._0_8_ = (a->z).n[3];
      auVar612._8_8_ = 0;
      auVar612._0_8_ = uVar948;
      auVar202._8_8_ = 0;
      auVar202._0_8_ = (a->z).n[4];
      auVar613._8_8_ = 0;
      auVar613._0_8_ = uVar931;
      auVar203._8_8_ = 0;
      auVar203._0_8_ = uVar955 >> 0x34 | SUB168(auVar196 * auVar608,8) << 0xc;
      auVar2 = auVar198 * auVar609 + auVar867 + auVar199 * auVar610 + auVar200 * auVar611 +
               auVar201 * auVar612 + auVar202 * auVar613 + auVar203 * ZEXT816(0x1000003d10);
      uVar955 = auVar2._0_8_;
      auVar868._8_8_ = 0;
      auVar868._0_8_ = uVar955 >> 0x34 | auVar2._8_8_ << 0xc;
      local_a8 = (uVar955 & 0xfffffffffffff) >> 0x30;
      auVar204._8_8_ = 0;
      auVar204._0_8_ = local_1f8->n[0];
      auVar614._8_8_ = 0;
      auVar614._0_8_ = uVar931;
      auVar205._8_8_ = 0;
      auVar205._0_8_ = (a->z).n[1];
      auVar615._8_8_ = 0;
      auVar615._0_8_ = uVar949;
      auVar206._8_8_ = 0;
      auVar206._0_8_ = (a->z).n[2];
      auVar616._8_8_ = 0;
      auVar616._0_8_ = uVar953;
      auVar207._8_8_ = 0;
      auVar207._0_8_ = (a->z).n[3];
      auVar617._8_8_ = 0;
      auVar617._0_8_ = uVar950;
      auVar208._8_8_ = 0;
      auVar208._0_8_ = (a->z).n[4];
      auVar618._8_8_ = 0;
      auVar618._0_8_ = uVar948;
      auVar2 = auVar205 * auVar615 + auVar868 + auVar206 * auVar616 + auVar207 * auVar617 +
               auVar208 * auVar618;
      uVar942 = auVar2._0_8_;
      auVar870._8_8_ = 0;
      auVar870._0_8_ = uVar942 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar619._8_8_ = 0;
      auVar619._0_8_ = (uVar942 & 0xfffffffffffff) << 4 | local_a8;
      auVar2 = auVar204 * auVar614 + ZEXT816(0x1000003d1) * auVar619;
      uVar942 = auVar2._0_8_;
      local_148 = uVar942 & 0xfffffffffffff;
      auVar869._8_8_ = 0;
      auVar869._0_8_ = uVar942 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar209._8_8_ = 0;
      auVar209._0_8_ = local_1f8->n[0];
      auVar620._8_8_ = 0;
      auVar620._0_8_ = uVar948;
      auVar210._8_8_ = 0;
      auVar210._0_8_ = (a->z).n[1];
      auVar621._8_8_ = 0;
      auVar621._0_8_ = uVar931;
      auVar211._8_8_ = 0;
      auVar211._0_8_ = (a->z).n[2];
      auVar622._8_8_ = 0;
      auVar622._0_8_ = uVar949;
      auVar212._8_8_ = 0;
      auVar212._0_8_ = (a->z).n[3];
      auVar623._8_8_ = 0;
      auVar623._0_8_ = uVar953;
      auVar213._8_8_ = 0;
      auVar213._0_8_ = (a->z).n[4];
      auVar624._8_8_ = 0;
      auVar624._0_8_ = uVar950;
      auVar3 = auVar211 * auVar622 + auVar870 + auVar212 * auVar623 + auVar213 * auVar624;
      uVar942 = auVar3._0_8_;
      auVar214._8_8_ = 0;
      auVar214._0_8_ = uVar942 & 0xfffffffffffff;
      auVar2 = auVar209 * auVar620 + auVar869 + auVar210 * auVar621 +
               auVar214 * ZEXT816(0x1000003d10);
      uVar952 = auVar2._0_8_;
      auVar872._8_8_ = 0;
      auVar872._0_8_ = uVar942 >> 0x34 | auVar3._8_8_ << 0xc;
      local_140 = uVar952 & 0xfffffffffffff;
      auVar871._8_8_ = 0;
      auVar871._0_8_ = uVar952 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar215._8_8_ = 0;
      auVar215._0_8_ = local_1f8->n[0];
      auVar625._8_8_ = 0;
      auVar625._0_8_ = uVar950;
      auVar216._8_8_ = 0;
      auVar216._0_8_ = (a->z).n[1];
      auVar626._8_8_ = 0;
      auVar626._0_8_ = uVar948;
      auVar217._8_8_ = 0;
      auVar217._0_8_ = (a->z).n[2];
      auVar627._8_8_ = 0;
      auVar627._0_8_ = uVar931;
      auVar218._8_8_ = 0;
      auVar218._0_8_ = (a->z).n[3];
      auVar628._8_8_ = 0;
      auVar628._0_8_ = uVar949;
      auVar219._8_8_ = 0;
      auVar219._0_8_ = (a->z).n[4];
      auVar629._8_8_ = 0;
      auVar629._0_8_ = uVar953;
      auVar3 = auVar218 * auVar628 + auVar872 + auVar219 * auVar629;
      uVar950 = auVar3._0_8_;
      auVar220._8_8_ = 0;
      auVar220._0_8_ = uVar950 & 0xfffffffffffff;
      auVar2 = auVar215 * auVar625 + auVar871 + auVar216 * auVar626 + auVar217 * auVar627 +
               auVar220 * ZEXT816(0x1000003d10);
      uVar953 = auVar2._0_8_;
      local_138 = uVar953 & 0xfffffffffffff;
      auVar873._8_8_ = 0;
      auVar873._0_8_ = (uVar953 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar941 & 0xfffffffffffff);
      auVar221._8_8_ = 0;
      auVar221._0_8_ = uVar950 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar873 = auVar221 * ZEXT816(0x1000003d10) + auVar873;
      uVar950 = auVar873._0_8_;
      local_130 = uVar950 & 0xfffffffffffff;
      local_128 = (uVar950 >> 0x34 | auVar873._8_8_ << 0xc) + (uVar955 & 0xffffffffffff);
      local_198.n[0] = (0x3ffffbfffff0bc - local_f8) + local_120;
      local_198.n[1] = (0x3ffffffffffffc - local_f0) + local_118;
      local_198.n[2] = (0x3ffffffffffffc - local_e8) + local_110;
      local_198.n[3] = (0x3ffffffffffffc - local_e0) + local_108;
      local_198.n[4] = (0x3fffffffffffc - local_d8) + local_100;
      local_230.n[0] = (0x3ffffbfffff0bc - local_170) + local_148;
      local_230.n[1] = (0x3ffffffffffffc - local_168) + local_140;
      local_230.n[2] = (0x3ffffffffffffc - local_160) + local_138;
      local_230.n[3] = (0x3ffffffffffffc - local_158) + local_130;
      local_230.n[4] = (0x3fffffffffffc - local_150) + local_128;
      local_208 = r;
      iVar930 = secp256k1_fe_normalizes_to_zero_var(&local_198);
      r_00 = local_208;
      if (iVar930 == 0) {
        auVar222._8_8_ = 0;
        auVar222._0_8_ = local_230.n[0] * 2;
        auVar630._8_8_ = 0;
        auVar630._0_8_ = local_230.n[3];
        auVar223._8_8_ = 0;
        auVar223._0_8_ = local_230.n[1] * 2;
        auVar631._8_8_ = 0;
        auVar631._0_8_ = local_230.n[2];
        auVar224._8_8_ = 0;
        auVar224._0_8_ = local_230.n[4];
        auVar632._8_8_ = 0;
        auVar632._0_8_ = local_230.n[4];
        uVar953 = SUB168(auVar224 * auVar632,0);
        auVar225._8_8_ = 0;
        auVar225._0_8_ = uVar953 & 0xfffffffffffff;
        auVar2 = auVar223 * auVar631 + auVar222 * auVar630 + auVar225 * ZEXT816(0x1000003d10);
        uVar955 = auVar2._0_8_;
        auVar874._8_8_ = 0;
        auVar874._0_8_ = uVar955 >> 0x34 | auVar2._8_8_ << 0xc;
        uVar950 = local_230.n[4] * 2;
        auVar226._8_8_ = 0;
        auVar226._0_8_ = local_230.n[0];
        auVar633._8_8_ = 0;
        auVar633._0_8_ = uVar950;
        auVar227._8_8_ = 0;
        auVar227._0_8_ = local_230.n[1] * 2;
        auVar634._8_8_ = 0;
        auVar634._0_8_ = local_230.n[3];
        auVar228._8_8_ = 0;
        auVar228._0_8_ = local_230.n[2];
        auVar635._8_8_ = 0;
        auVar635._0_8_ = local_230.n[2];
        auVar229._8_8_ = 0;
        auVar229._0_8_ = uVar953 >> 0x34 | SUB168(auVar224 * auVar632,8) << 0xc;
        auVar2 = auVar226 * auVar633 + auVar874 + auVar227 * auVar634 + auVar228 * auVar635 +
                 auVar229 * ZEXT816(0x1000003d10);
        uVar951 = auVar2._0_8_;
        auVar875._8_8_ = 0;
        auVar875._0_8_ = uVar951 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar230._8_8_ = 0;
        auVar230._0_8_ = local_230.n[0];
        auVar636._8_8_ = 0;
        auVar636._0_8_ = local_230.n[0];
        auVar231._8_8_ = 0;
        auVar231._0_8_ = local_230.n[1];
        auVar637._8_8_ = 0;
        auVar637._0_8_ = uVar950;
        auVar232._8_8_ = 0;
        auVar232._0_8_ = local_230.n[2] * 2;
        auVar638._8_8_ = 0;
        auVar638._0_8_ = local_230.n[3];
        auVar2 = auVar231 * auVar637 + auVar875 + auVar232 * auVar638;
        uVar953 = auVar2._0_8_;
        auVar877._8_8_ = 0;
        auVar877._0_8_ = uVar953 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar639._8_8_ = 0;
        auVar639._0_8_ = (uVar953 & 0xfffffffffffff) << 4 | (uVar951 & 0xfffffffffffff) >> 0x30;
        auVar2 = auVar230 * auVar636 + ZEXT816(0x1000003d1) * auVar639;
        uVar956 = auVar2._0_8_;
        auVar876._8_8_ = 0;
        auVar876._0_8_ = uVar956 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar233._8_8_ = 0;
        auVar233._0_8_ = local_230.n[0] * 2;
        auVar640._8_8_ = 0;
        auVar640._0_8_ = local_230.n[1];
        auVar234._8_8_ = 0;
        auVar234._0_8_ = local_230.n[2];
        auVar641._8_8_ = 0;
        auVar641._0_8_ = uVar950;
        auVar235._8_8_ = 0;
        auVar235._0_8_ = local_230.n[3];
        auVar642._8_8_ = 0;
        auVar642._0_8_ = local_230.n[3];
        auVar3 = auVar234 * auVar641 + auVar877 + auVar235 * auVar642;
        uVar953 = auVar3._0_8_;
        auVar236._8_8_ = 0;
        auVar236._0_8_ = uVar953 & 0xfffffffffffff;
        auVar2 = auVar233 * auVar640 + auVar876 + auVar236 * ZEXT816(0x1000003d10);
        uVar957 = auVar2._0_8_;
        auVar879._8_8_ = 0;
        auVar879._0_8_ = uVar953 >> 0x34 | auVar3._8_8_ << 0xc;
        auVar878._8_8_ = 0;
        auVar878._0_8_ = uVar957 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar237._8_8_ = 0;
        auVar237._0_8_ = local_230.n[0] * 2;
        auVar643._8_8_ = 0;
        auVar643._0_8_ = local_230.n[2];
        auVar238._8_8_ = 0;
        auVar238._0_8_ = local_230.n[1];
        auVar644._8_8_ = 0;
        auVar644._0_8_ = local_230.n[1];
        auVar239._8_8_ = 0;
        auVar239._0_8_ = local_230.n[3];
        auVar645._8_8_ = 0;
        auVar645._0_8_ = uVar950;
        auVar879 = auVar239 * auVar645 + auVar879;
        uVar950 = auVar879._0_8_;
        auVar240._8_8_ = 0;
        auVar240._0_8_ = uVar950 & 0xfffffffffffff;
        auVar2 = auVar237 * auVar643 + auVar878 + auVar238 * auVar644 +
                 auVar240 * ZEXT816(0x1000003d10);
        uVar958 = auVar2._0_8_;
        auVar880._8_8_ = 0;
        auVar880._0_8_ = (uVar958 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar955 & 0xfffffffffffff);
        auVar241._8_8_ = 0;
        auVar241._0_8_ = uVar950 >> 0x34 | auVar879._8_8_ << 0xc;
        auVar880 = auVar241 * ZEXT816(0x1000003d10) + auVar880;
        uVar959 = auVar880._0_8_;
        auVar242._8_8_ = 0;
        auVar242._0_8_ = local_198.n[0] * 2;
        auVar646._8_8_ = 0;
        auVar646._0_8_ = local_198.n[3];
        auVar243._8_8_ = 0;
        auVar243._0_8_ = local_198.n[1] * 2;
        auVar647._8_8_ = 0;
        auVar647._0_8_ = local_198.n[2];
        auVar244._8_8_ = 0;
        auVar244._0_8_ = local_198.n[4];
        auVar648._8_8_ = 0;
        auVar648._0_8_ = local_198.n[4];
        uVar953 = SUB168(auVar244 * auVar648,0);
        auVar245._8_8_ = 0;
        auVar245._0_8_ = uVar953 & 0xfffffffffffff;
        auVar2 = auVar243 * auVar647 + auVar242 * auVar646 + auVar245 * ZEXT816(0x1000003d10);
        uVar955 = auVar2._0_8_;
        auVar881._8_8_ = 0;
        auVar881._0_8_ = uVar955 >> 0x34 | auVar2._8_8_ << 0xc;
        uVar950 = local_198.n[4] * 2;
        auVar246._8_8_ = 0;
        auVar246._0_8_ = local_198.n[0];
        auVar649._8_8_ = 0;
        auVar649._0_8_ = uVar950;
        auVar247._8_8_ = 0;
        auVar247._0_8_ = local_198.n[1] * 2;
        auVar650._8_8_ = 0;
        auVar650._0_8_ = local_198.n[3];
        auVar248._8_8_ = 0;
        auVar248._0_8_ = local_198.n[2];
        auVar651._8_8_ = 0;
        auVar651._0_8_ = local_198.n[2];
        auVar249._8_8_ = 0;
        auVar249._0_8_ = uVar953 >> 0x34 | SUB168(auVar244 * auVar648,8) << 0xc;
        auVar2 = auVar246 * auVar649 + auVar881 + auVar247 * auVar650 + auVar248 * auVar651 +
                 auVar249 * ZEXT816(0x1000003d10);
        uVar953 = auVar2._0_8_;
        auVar882._8_8_ = 0;
        auVar882._0_8_ = uVar953 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar250._8_8_ = 0;
        auVar250._0_8_ = local_198.n[0];
        auVar652._8_8_ = 0;
        auVar652._0_8_ = local_198.n[0];
        auVar251._8_8_ = 0;
        auVar251._0_8_ = local_198.n[1];
        auVar653._8_8_ = 0;
        auVar653._0_8_ = uVar950;
        auVar252._8_8_ = 0;
        auVar252._0_8_ = local_198.n[2] * 2;
        auVar654._8_8_ = 0;
        auVar654._0_8_ = local_198.n[3];
        auVar2 = auVar251 * auVar653 + auVar882 + auVar252 * auVar654;
        uVar941 = auVar2._0_8_;
        auVar884._8_8_ = 0;
        auVar884._0_8_ = uVar941 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar655._8_8_ = 0;
        auVar655._0_8_ = (uVar941 & 0xfffffffffffff) << 4 | (uVar953 & 0xfffffffffffff) >> 0x30;
        auVar2 = auVar250 * auVar652 + ZEXT816(0x1000003d1) * auVar655;
        uVar941 = auVar2._0_8_;
        uVar931 = uVar941 & 0xfffffffffffff;
        auVar883._8_8_ = 0;
        auVar883._0_8_ = uVar941 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar253._8_8_ = 0;
        auVar253._0_8_ = local_198.n[0] * 2;
        auVar656._8_8_ = 0;
        auVar656._0_8_ = local_198.n[1];
        auVar254._8_8_ = 0;
        auVar254._0_8_ = local_198.n[2];
        auVar657._8_8_ = 0;
        auVar657._0_8_ = uVar950;
        auVar255._8_8_ = 0;
        auVar255._0_8_ = local_198.n[3];
        auVar658._8_8_ = 0;
        auVar658._0_8_ = local_198.n[3];
        auVar3 = auVar254 * auVar657 + auVar884 + auVar255 * auVar658;
        uVar941 = auVar3._0_8_;
        auVar256._8_8_ = 0;
        auVar256._0_8_ = uVar941 & 0xfffffffffffff;
        auVar2 = auVar253 * auVar656 + auVar883 + auVar256 * ZEXT816(0x1000003d10);
        uVar942 = auVar2._0_8_;
        auVar886._8_8_ = 0;
        auVar886._0_8_ = uVar941 >> 0x34 | auVar3._8_8_ << 0xc;
        uVar948 = uVar942 & 0xfffffffffffff;
        auVar885._8_8_ = 0;
        auVar885._0_8_ = uVar942 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar257._8_8_ = 0;
        auVar257._0_8_ = local_198.n[0] * 2;
        auVar659._8_8_ = 0;
        auVar659._0_8_ = local_198.n[2];
        auVar258._8_8_ = 0;
        auVar258._0_8_ = local_198.n[1];
        auVar660._8_8_ = 0;
        auVar660._0_8_ = local_198.n[1];
        auVar259._8_8_ = 0;
        auVar259._0_8_ = local_198.n[3];
        auVar661._8_8_ = 0;
        auVar661._0_8_ = uVar950;
        auVar886 = auVar259 * auVar661 + auVar886;
        uVar950 = auVar886._0_8_;
        auVar260._8_8_ = 0;
        auVar260._0_8_ = uVar950 & 0xfffffffffffff;
        auVar2 = auVar257 * auVar659 + auVar885 + auVar258 * auVar660 +
                 auVar260 * ZEXT816(0x1000003d10);
        uVar941 = auVar2._0_8_;
        uVar949 = uVar941 & 0xfffffffffffff;
        auVar887._8_8_ = 0;
        auVar887._0_8_ = (uVar941 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar955 & 0xfffffffffffff);
        auVar261._8_8_ = 0;
        auVar261._0_8_ = uVar950 >> 0x34 | auVar886._8_8_ << 0xc;
        auVar887 = auVar261 * ZEXT816(0x1000003d10) + auVar887;
        uVar950 = auVar887._0_8_;
        uVar952 = uVar950 & 0xfffffffffffff;
        uVar960 = (uVar950 >> 0x34 | auVar887._8_8_ << 0xc) + (uVar953 & 0xffffffffffff);
        auVar262._8_8_ = 0;
        auVar262._0_8_ = uVar931;
        auVar662._8_8_ = 0;
        auVar662._0_8_ = local_198.n[3];
        auVar263._8_8_ = 0;
        auVar263._0_8_ = uVar948;
        auVar663._8_8_ = 0;
        auVar663._0_8_ = local_198.n[2];
        auVar264._8_8_ = 0;
        auVar264._0_8_ = uVar949;
        auVar664._8_8_ = 0;
        auVar664._0_8_ = local_198.n[1];
        auVar265._8_8_ = 0;
        auVar265._0_8_ = uVar952;
        auVar665._8_8_ = 0;
        auVar665._0_8_ = local_198.n[0];
        auVar266._8_8_ = 0;
        auVar266._0_8_ = uVar960;
        auVar666._8_8_ = 0;
        auVar666._0_8_ = local_198.n[4];
        uVar950 = SUB168(auVar266 * auVar666,0);
        auVar267._8_8_ = 0;
        auVar267._0_8_ = uVar950 & 0xfffffffffffff;
        auVar2 = auVar263 * auVar663 + auVar262 * auVar662 + auVar264 * auVar664 +
                 auVar265 * auVar665 + auVar267 * ZEXT816(0x1000003d10);
        uVar953 = auVar2._0_8_;
        auVar888._8_8_ = 0;
        auVar888._0_8_ = uVar953 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar268._8_8_ = 0;
        auVar268._0_8_ = uVar931;
        auVar667._8_8_ = 0;
        auVar667._0_8_ = local_198.n[4];
        auVar269._8_8_ = 0;
        auVar269._0_8_ = uVar948;
        auVar668._8_8_ = 0;
        auVar668._0_8_ = local_198.n[3];
        auVar270._8_8_ = 0;
        auVar270._0_8_ = uVar949;
        auVar669._8_8_ = 0;
        auVar669._0_8_ = local_198.n[2];
        auVar271._8_8_ = 0;
        auVar271._0_8_ = uVar952;
        auVar670._8_8_ = 0;
        auVar670._0_8_ = local_198.n[1];
        auVar272._8_8_ = 0;
        auVar272._0_8_ = uVar960;
        auVar671._8_8_ = 0;
        auVar671._0_8_ = local_198.n[0];
        auVar273._8_8_ = 0;
        auVar273._0_8_ = uVar950 >> 0x34 | SUB168(auVar266 * auVar666,8) << 0xc;
        auVar2 = auVar268 * auVar667 + auVar888 + auVar269 * auVar668 + auVar270 * auVar669 +
                 auVar271 * auVar670 + auVar272 * auVar671 + auVar273 * ZEXT816(0x1000003d10);
        uVar950 = auVar2._0_8_;
        auVar889._8_8_ = 0;
        auVar889._0_8_ = uVar950 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar274._8_8_ = 0;
        auVar274._0_8_ = uVar931;
        auVar672._8_8_ = 0;
        auVar672._0_8_ = local_198.n[0];
        auVar275._8_8_ = 0;
        auVar275._0_8_ = uVar948;
        auVar673._8_8_ = 0;
        auVar673._0_8_ = local_198.n[4];
        auVar276._8_8_ = 0;
        auVar276._0_8_ = uVar949;
        auVar674._8_8_ = 0;
        auVar674._0_8_ = local_198.n[3];
        auVar277._8_8_ = 0;
        auVar277._0_8_ = uVar952;
        auVar675._8_8_ = 0;
        auVar675._0_8_ = local_198.n[2];
        auVar278._8_8_ = 0;
        auVar278._0_8_ = uVar960;
        auVar676._8_8_ = 0;
        auVar676._0_8_ = local_198.n[1];
        auVar2 = auVar275 * auVar673 + auVar889 + auVar276 * auVar674 + auVar277 * auVar675 +
                 auVar278 * auVar676;
        uVar955 = auVar2._0_8_;
        auVar891._8_8_ = 0;
        auVar891._0_8_ = uVar955 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar677._8_8_ = 0;
        auVar677._0_8_ = (uVar955 & 0xfffffffffffff) << 4 | (uVar950 & 0xfffffffffffff) >> 0x30;
        auVar2 = auVar274 * auVar672 + ZEXT816(0x1000003d1) * auVar677;
        uVar955 = auVar2._0_8_;
        uVar954 = uVar955 & 0xfffffffffffff;
        auVar890._8_8_ = 0;
        auVar890._0_8_ = uVar955 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar279._8_8_ = 0;
        auVar279._0_8_ = uVar931;
        auVar678._8_8_ = 0;
        auVar678._0_8_ = local_198.n[1];
        auVar280._8_8_ = 0;
        auVar280._0_8_ = uVar948;
        auVar679._8_8_ = 0;
        auVar679._0_8_ = local_198.n[0];
        auVar281._8_8_ = 0;
        auVar281._0_8_ = uVar949;
        auVar680._8_8_ = 0;
        auVar680._0_8_ = local_198.n[4];
        auVar282._8_8_ = 0;
        auVar282._0_8_ = uVar952;
        auVar681._8_8_ = 0;
        auVar681._0_8_ = local_198.n[3];
        auVar283._8_8_ = 0;
        auVar283._0_8_ = uVar960;
        auVar682._8_8_ = 0;
        auVar682._0_8_ = local_198.n[2];
        auVar3 = auVar281 * auVar680 + auVar891 + auVar282 * auVar681 + auVar283 * auVar682;
        uVar955 = auVar3._0_8_;
        auVar284._8_8_ = 0;
        auVar284._0_8_ = uVar955 & 0xfffffffffffff;
        auVar2 = auVar279 * auVar678 + auVar890 + auVar280 * auVar679 +
                 auVar284 * ZEXT816(0x1000003d10);
        uVar941 = auVar2._0_8_;
        auVar893._8_8_ = 0;
        auVar893._0_8_ = uVar955 >> 0x34 | auVar3._8_8_ << 0xc;
        uVar932 = uVar941 & 0xfffffffffffff;
        auVar892._8_8_ = 0;
        auVar892._0_8_ = uVar941 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar285._8_8_ = 0;
        auVar285._0_8_ = uVar931;
        auVar683._8_8_ = 0;
        auVar683._0_8_ = local_198.n[2];
        auVar286._8_8_ = 0;
        auVar286._0_8_ = uVar948;
        auVar684._8_8_ = 0;
        auVar684._0_8_ = local_198.n[1];
        auVar287._8_8_ = 0;
        auVar287._0_8_ = uVar949;
        auVar685._8_8_ = 0;
        auVar685._0_8_ = local_198.n[0];
        auVar288._8_8_ = 0;
        auVar288._0_8_ = uVar952;
        auVar686._8_8_ = 0;
        auVar686._0_8_ = local_198.n[4];
        auVar289._8_8_ = 0;
        auVar289._0_8_ = uVar960;
        auVar687._8_8_ = 0;
        auVar687._0_8_ = local_198.n[3];
        auVar3 = auVar288 * auVar686 + auVar893 + auVar289 * auVar687;
        uVar955 = auVar3._0_8_;
        auVar290._8_8_ = 0;
        auVar290._0_8_ = uVar955 & 0xfffffffffffff;
        auVar2 = auVar285 * auVar683 + auVar892 + auVar286 * auVar684 + auVar287 * auVar685 +
                 auVar290 * ZEXT816(0x1000003d10);
        uVar941 = auVar2._0_8_;
        uVar933 = uVar941 & 0xfffffffffffff;
        auVar894._8_8_ = 0;
        auVar894._0_8_ = (uVar941 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar953 & 0xfffffffffffff);
        auVar291._8_8_ = 0;
        auVar291._0_8_ = uVar955 >> 0x34 | auVar3._8_8_ << 0xc;
        auVar894 = auVar291 * ZEXT816(0x1000003d10) + auVar894;
        uVar953 = auVar894._0_8_;
        uVar934 = uVar953 & 0xfffffffffffff;
        uVar961 = (uVar953 >> 0x34 | auVar894._8_8_ << 0xc) + (uVar950 & 0xffffffffffff);
        auVar292._8_8_ = 0;
        auVar292._0_8_ = local_200->n[0];
        auVar688._8_8_ = 0;
        auVar688._0_8_ = local_198.n[3];
        auVar293._8_8_ = 0;
        auVar293._0_8_ = local_200->n[1];
        auVar689._8_8_ = 0;
        auVar689._0_8_ = local_198.n[2];
        auVar294._8_8_ = 0;
        auVar294._0_8_ = local_200->n[2];
        auVar690._8_8_ = 0;
        auVar690._0_8_ = local_198.n[1];
        auVar295._8_8_ = 0;
        auVar295._0_8_ = local_200->n[3];
        auVar691._8_8_ = 0;
        auVar691._0_8_ = local_198.n[0];
        auVar296._8_8_ = 0;
        auVar296._0_8_ = local_200->n[4];
        auVar692._8_8_ = 0;
        auVar692._0_8_ = local_198.n[4];
        uVar950 = SUB168(auVar296 * auVar692,0);
        auVar297._8_8_ = 0;
        auVar297._0_8_ = uVar950 & 0xfffffffffffff;
        auVar2 = auVar293 * auVar689 + auVar292 * auVar688 + auVar294 * auVar690 +
                 auVar295 * auVar691 + auVar297 * ZEXT816(0x1000003d10);
        uVar953 = auVar2._0_8_;
        auVar895._8_8_ = 0;
        auVar895._0_8_ = uVar953 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar298._8_8_ = 0;
        auVar298._0_8_ = local_200->n[0];
        auVar693._8_8_ = 0;
        auVar693._0_8_ = local_198.n[4];
        auVar299._8_8_ = 0;
        auVar299._0_8_ = local_200->n[1];
        auVar694._8_8_ = 0;
        auVar694._0_8_ = local_198.n[3];
        auVar300._8_8_ = 0;
        auVar300._0_8_ = local_200->n[2];
        auVar695._8_8_ = 0;
        auVar695._0_8_ = local_198.n[2];
        auVar301._8_8_ = 0;
        auVar301._0_8_ = local_200->n[3];
        auVar696._8_8_ = 0;
        auVar696._0_8_ = local_198.n[1];
        auVar302._8_8_ = 0;
        auVar302._0_8_ = local_200->n[4];
        auVar697._8_8_ = 0;
        auVar697._0_8_ = local_198.n[0];
        auVar303._8_8_ = 0;
        auVar303._0_8_ = uVar950 >> 0x34 | SUB168(auVar296 * auVar692,8) << 0xc;
        auVar2 = auVar298 * auVar693 + auVar895 + auVar299 * auVar694 + auVar300 * auVar695 +
                 auVar301 * auVar696 + auVar302 * auVar697 + auVar303 * ZEXT816(0x1000003d10);
        uVar950 = auVar2._0_8_;
        auVar896._8_8_ = 0;
        auVar896._0_8_ = uVar950 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar304._8_8_ = 0;
        auVar304._0_8_ = local_200->n[0];
        auVar698._8_8_ = 0;
        auVar698._0_8_ = local_198.n[0];
        auVar305._8_8_ = 0;
        auVar305._0_8_ = local_200->n[1];
        auVar699._8_8_ = 0;
        auVar699._0_8_ = local_198.n[4];
        auVar306._8_8_ = 0;
        auVar306._0_8_ = local_200->n[2];
        auVar700._8_8_ = 0;
        auVar700._0_8_ = local_198.n[3];
        auVar307._8_8_ = 0;
        auVar307._0_8_ = local_200->n[3];
        auVar701._8_8_ = 0;
        auVar701._0_8_ = local_198.n[2];
        auVar308._8_8_ = 0;
        auVar308._0_8_ = local_200->n[4];
        auVar702._8_8_ = 0;
        auVar702._0_8_ = local_198.n[1];
        auVar2 = auVar305 * auVar699 + auVar896 + auVar306 * auVar700 + auVar307 * auVar701 +
                 auVar308 * auVar702;
        uVar955 = auVar2._0_8_;
        auVar898._8_8_ = 0;
        auVar898._0_8_ = uVar955 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar703._8_8_ = 0;
        auVar703._0_8_ = (uVar955 & 0xfffffffffffff) << 4 | (uVar950 & 0xfffffffffffff) >> 0x30;
        auVar2 = auVar304 * auVar698 + ZEXT816(0x1000003d1) * auVar703;
        uVar955 = auVar2._0_8_;
        uVar935 = uVar955 & 0xfffffffffffff;
        auVar897._8_8_ = 0;
        auVar897._0_8_ = uVar955 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar309._8_8_ = 0;
        auVar309._0_8_ = local_200->n[0];
        auVar704._8_8_ = 0;
        auVar704._0_8_ = local_198.n[1];
        auVar310._8_8_ = 0;
        auVar310._0_8_ = local_200->n[1];
        auVar705._8_8_ = 0;
        auVar705._0_8_ = local_198.n[0];
        auVar311._8_8_ = 0;
        auVar311._0_8_ = local_200->n[2];
        auVar706._8_8_ = 0;
        auVar706._0_8_ = local_198.n[4];
        auVar312._8_8_ = 0;
        auVar312._0_8_ = local_200->n[3];
        auVar707._8_8_ = 0;
        auVar707._0_8_ = local_198.n[3];
        auVar313._8_8_ = 0;
        auVar313._0_8_ = local_200->n[4];
        auVar708._8_8_ = 0;
        auVar708._0_8_ = local_198.n[2];
        auVar3 = auVar311 * auVar706 + auVar898 + auVar312 * auVar707 + auVar313 * auVar708;
        uVar955 = auVar3._0_8_;
        auVar314._8_8_ = 0;
        auVar314._0_8_ = uVar955 & 0xfffffffffffff;
        auVar2 = auVar309 * auVar704 + auVar897 + auVar310 * auVar705 +
                 auVar314 * ZEXT816(0x1000003d10);
        uVar941 = auVar2._0_8_;
        auVar900._8_8_ = 0;
        auVar900._0_8_ = uVar955 >> 0x34 | auVar3._8_8_ << 0xc;
        uVar936 = uVar941 & 0xfffffffffffff;
        auVar899._8_8_ = 0;
        auVar899._0_8_ = uVar941 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar315._8_8_ = 0;
        auVar315._0_8_ = local_200->n[0];
        auVar709._8_8_ = 0;
        auVar709._0_8_ = local_198.n[2];
        auVar316._8_8_ = 0;
        auVar316._0_8_ = local_200->n[1];
        auVar710._8_8_ = 0;
        auVar710._0_8_ = local_198.n[1];
        auVar317._8_8_ = 0;
        auVar317._0_8_ = local_200->n[2];
        auVar711._8_8_ = 0;
        auVar711._0_8_ = local_198.n[0];
        auVar318._8_8_ = 0;
        auVar318._0_8_ = local_200->n[3];
        auVar712._8_8_ = 0;
        auVar712._0_8_ = local_198.n[4];
        auVar319._8_8_ = 0;
        auVar319._0_8_ = local_200->n[4];
        auVar713._8_8_ = 0;
        auVar713._0_8_ = local_198.n[3];
        auVar3 = auVar318 * auVar712 + auVar900 + auVar319 * auVar713;
        uVar955 = auVar3._0_8_;
        auVar320._8_8_ = 0;
        auVar320._0_8_ = uVar955 & 0xfffffffffffff;
        auVar2 = auVar315 * auVar709 + auVar899 + auVar316 * auVar710 + auVar317 * auVar711 +
                 auVar320 * ZEXT816(0x1000003d10);
        uVar941 = auVar2._0_8_;
        uVar937 = uVar941 & 0xfffffffffffff;
        auVar901._8_8_ = 0;
        auVar901._0_8_ = (uVar941 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar953 & 0xfffffffffffff);
        auVar321._8_8_ = 0;
        auVar321._0_8_ = uVar955 >> 0x34 | auVar3._8_8_ << 0xc;
        auVar901 = auVar321 * ZEXT816(0x1000003d10) + auVar901;
        uVar953 = auVar901._0_8_;
        uVar938 = uVar953 & 0xfffffffffffff;
        uVar962 = (uVar953 >> 0x34 | auVar901._8_8_ << 0xc) + (uVar950 & 0xffffffffffff);
        uVar950 = local_1f8->n[0];
        uVar953 = local_1f8->n[1];
        uVar955 = local_1f8->n[2];
        uVar941 = local_1f8->n[3];
        uVar942 = local_1f8->n[4];
        auVar322._8_8_ = 0;
        auVar322._0_8_ = uVar935;
        auVar714._8_8_ = 0;
        auVar714._0_8_ = uVar941;
        auVar323._8_8_ = 0;
        auVar323._0_8_ = uVar936;
        auVar715._8_8_ = 0;
        auVar715._0_8_ = uVar955;
        auVar324._8_8_ = 0;
        auVar324._0_8_ = uVar937;
        auVar716._8_8_ = 0;
        auVar716._0_8_ = uVar953;
        auVar325._8_8_ = 0;
        auVar325._0_8_ = uVar938;
        auVar717._8_8_ = 0;
        auVar717._0_8_ = uVar950;
        auVar326._8_8_ = 0;
        auVar326._0_8_ = uVar962;
        auVar718._8_8_ = 0;
        auVar718._0_8_ = uVar942;
        uVar939 = SUB168(auVar326 * auVar718,0);
        auVar327._8_8_ = 0;
        auVar327._0_8_ = uVar939 & 0xfffffffffffff;
        auVar2 = auVar323 * auVar715 + auVar322 * auVar714 + auVar324 * auVar716 +
                 auVar325 * auVar717 + auVar327 * ZEXT816(0x1000003d10);
        uVar943 = auVar2._0_8_;
        auVar902._8_8_ = 0;
        auVar902._0_8_ = uVar943 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar328._8_8_ = 0;
        auVar328._0_8_ = uVar935;
        auVar719._8_8_ = 0;
        auVar719._0_8_ = uVar942;
        auVar329._8_8_ = 0;
        auVar329._0_8_ = uVar936;
        auVar720._8_8_ = 0;
        auVar720._0_8_ = uVar941;
        auVar330._8_8_ = 0;
        auVar330._0_8_ = uVar937;
        auVar721._8_8_ = 0;
        auVar721._0_8_ = uVar955;
        auVar331._8_8_ = 0;
        auVar331._0_8_ = uVar938;
        auVar722._8_8_ = 0;
        auVar722._0_8_ = uVar953;
        auVar332._8_8_ = 0;
        auVar332._0_8_ = uVar962;
        auVar723._8_8_ = 0;
        auVar723._0_8_ = uVar950;
        auVar333._8_8_ = 0;
        auVar333._0_8_ = uVar939 >> 0x34 | SUB168(auVar326 * auVar718,8) << 0xc;
        auVar2 = auVar328 * auVar719 + auVar902 + auVar329 * auVar720 + auVar330 * auVar721 +
                 auVar331 * auVar722 + auVar332 * auVar723 + auVar333 * ZEXT816(0x1000003d10);
        uVar939 = auVar2._0_8_;
        auVar903._8_8_ = 0;
        auVar903._0_8_ = uVar939 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar334._8_8_ = 0;
        auVar334._0_8_ = uVar935;
        auVar724._8_8_ = 0;
        auVar724._0_8_ = uVar950;
        auVar335._8_8_ = 0;
        auVar335._0_8_ = uVar936;
        auVar725._8_8_ = 0;
        auVar725._0_8_ = uVar942;
        auVar336._8_8_ = 0;
        auVar336._0_8_ = uVar937;
        auVar726._8_8_ = 0;
        auVar726._0_8_ = uVar941;
        auVar337._8_8_ = 0;
        auVar337._0_8_ = uVar938;
        auVar727._8_8_ = 0;
        auVar727._0_8_ = uVar955;
        auVar338._8_8_ = 0;
        auVar338._0_8_ = uVar962;
        auVar728._8_8_ = 0;
        auVar728._0_8_ = uVar953;
        auVar2 = auVar335 * auVar725 + auVar903 + auVar336 * auVar726 + auVar337 * auVar727 +
                 auVar338 * auVar728;
        uVar944 = auVar2._0_8_;
        auVar905._8_8_ = 0;
        auVar905._0_8_ = uVar944 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar729._8_8_ = 0;
        auVar729._0_8_ = (uVar944 & 0xfffffffffffff) << 4 | (uVar939 & 0xfffffffffffff) >> 0x30;
        auVar2 = auVar334 * auVar724 + ZEXT816(0x1000003d1) * auVar729;
        uVar944 = auVar2._0_8_;
        (local_208->z).n[0] = uVar944 & 0xfffffffffffff;
        auVar904._8_8_ = 0;
        auVar904._0_8_ = uVar944 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar339._8_8_ = 0;
        auVar339._0_8_ = uVar935;
        auVar730._8_8_ = 0;
        auVar730._0_8_ = uVar953;
        auVar340._8_8_ = 0;
        auVar340._0_8_ = uVar936;
        auVar731._8_8_ = 0;
        auVar731._0_8_ = uVar950;
        auVar341._8_8_ = 0;
        auVar341._0_8_ = uVar937;
        auVar732._8_8_ = 0;
        auVar732._0_8_ = uVar942;
        auVar342._8_8_ = 0;
        auVar342._0_8_ = uVar938;
        auVar733._8_8_ = 0;
        auVar733._0_8_ = uVar941;
        auVar343._8_8_ = 0;
        auVar343._0_8_ = uVar962;
        auVar734._8_8_ = 0;
        auVar734._0_8_ = uVar955;
        auVar3 = auVar341 * auVar732 + auVar905 + auVar342 * auVar733 + auVar343 * auVar734;
        uVar944 = auVar3._0_8_;
        auVar344._8_8_ = 0;
        auVar344._0_8_ = uVar944 & 0xfffffffffffff;
        auVar2 = auVar339 * auVar730 + auVar904 + auVar340 * auVar731 +
                 auVar344 * ZEXT816(0x1000003d10);
        uVar963 = auVar2._0_8_;
        auVar907._8_8_ = 0;
        auVar907._0_8_ = uVar944 >> 0x34 | auVar3._8_8_ << 0xc;
        (local_208->z).n[1] = uVar963 & 0xfffffffffffff;
        auVar906._8_8_ = 0;
        auVar906._0_8_ = uVar963 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar345._8_8_ = 0;
        auVar345._0_8_ = uVar935;
        auVar735._8_8_ = 0;
        auVar735._0_8_ = uVar955;
        auVar346._8_8_ = 0;
        auVar346._0_8_ = uVar936;
        auVar736._8_8_ = 0;
        auVar736._0_8_ = uVar953;
        auVar347._8_8_ = 0;
        auVar347._0_8_ = uVar937;
        auVar737._8_8_ = 0;
        auVar737._0_8_ = uVar950;
        auVar348._8_8_ = 0;
        auVar348._0_8_ = uVar938;
        auVar738._8_8_ = 0;
        auVar738._0_8_ = uVar942;
        auVar349._8_8_ = 0;
        auVar349._0_8_ = uVar962;
        auVar739._8_8_ = 0;
        auVar739._0_8_ = uVar941;
        auVar3 = auVar348 * auVar738 + auVar907 + auVar349 * auVar739;
        uVar950 = auVar3._0_8_;
        auVar350._8_8_ = 0;
        auVar350._0_8_ = uVar950 & 0xfffffffffffff;
        auVar2 = auVar345 * auVar735 + auVar906 + auVar346 * auVar736 + auVar347 * auVar737 +
                 auVar350 * ZEXT816(0x1000003d10);
        uVar953 = auVar2._0_8_;
        (local_208->z).n[2] = uVar953 & 0xfffffffffffff;
        auVar908._8_8_ = 0;
        auVar908._0_8_ = (uVar953 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar943 & 0xfffffffffffff);
        auVar351._8_8_ = 0;
        auVar351._0_8_ = uVar950 >> 0x34 | auVar3._8_8_ << 0xc;
        auVar908 = auVar351 * ZEXT816(0x1000003d10) + auVar908;
        uVar950 = auVar908._0_8_;
        (local_208->z).n[3] = uVar950 & 0xfffffffffffff;
        (local_208->z).n[4] = (uVar950 >> 0x34 | auVar908._8_8_ << 0xc) + (uVar939 & 0xffffffffffff)
        ;
        auVar352._8_8_ = 0;
        auVar352._0_8_ = uVar931;
        auVar740._8_8_ = 0;
        auVar740._0_8_ = local_e0;
        auVar353._8_8_ = 0;
        auVar353._0_8_ = uVar948;
        auVar741._8_8_ = 0;
        auVar741._0_8_ = local_e8;
        auVar354._8_8_ = 0;
        auVar354._0_8_ = uVar949;
        auVar742._8_8_ = 0;
        auVar742._0_8_ = local_f0;
        auVar355._8_8_ = 0;
        auVar355._0_8_ = uVar952;
        auVar743._8_8_ = 0;
        auVar743._0_8_ = local_f8;
        auVar356._8_8_ = 0;
        auVar356._0_8_ = uVar960;
        auVar744._8_8_ = 0;
        auVar744._0_8_ = local_d8;
        uVar950 = SUB168(auVar356 * auVar744,0);
        auVar357._8_8_ = 0;
        auVar357._0_8_ = uVar950 & 0xfffffffffffff;
        auVar2 = auVar353 * auVar741 + auVar352 * auVar740 + auVar354 * auVar742 +
                 auVar355 * auVar743 + auVar357 * ZEXT816(0x1000003d10);
        uVar941 = auVar2._0_8_;
        auVar909._8_8_ = 0;
        auVar909._0_8_ = uVar941 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar358._8_8_ = 0;
        auVar358._0_8_ = uVar931;
        auVar745._8_8_ = 0;
        auVar745._0_8_ = local_d8;
        auVar359._8_8_ = 0;
        auVar359._0_8_ = uVar948;
        auVar746._8_8_ = 0;
        auVar746._0_8_ = local_e0;
        auVar360._8_8_ = 0;
        auVar360._0_8_ = uVar949;
        auVar747._8_8_ = 0;
        auVar747._0_8_ = local_e8;
        auVar361._8_8_ = 0;
        auVar361._0_8_ = uVar952;
        auVar748._8_8_ = 0;
        auVar748._0_8_ = local_f0;
        auVar362._8_8_ = 0;
        auVar362._0_8_ = uVar960;
        auVar749._8_8_ = 0;
        auVar749._0_8_ = local_f8;
        auVar363._8_8_ = 0;
        auVar363._0_8_ = uVar950 >> 0x34 | SUB168(auVar356 * auVar744,8) << 0xc;
        auVar2 = auVar358 * auVar745 + auVar909 + auVar359 * auVar746 + auVar360 * auVar747 +
                 auVar361 * auVar748 + auVar362 * auVar749 + auVar363 * ZEXT816(0x1000003d10);
        uVar942 = auVar2._0_8_;
        auVar910._8_8_ = 0;
        auVar910._0_8_ = uVar942 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar364._8_8_ = 0;
        auVar364._0_8_ = uVar931;
        auVar750._8_8_ = 0;
        auVar750._0_8_ = local_f8;
        auVar365._8_8_ = 0;
        auVar365._0_8_ = uVar948;
        auVar751._8_8_ = 0;
        auVar751._0_8_ = local_d8;
        auVar366._8_8_ = 0;
        auVar366._0_8_ = uVar949;
        auVar752._8_8_ = 0;
        auVar752._0_8_ = local_e0;
        auVar367._8_8_ = 0;
        auVar367._0_8_ = uVar952;
        auVar753._8_8_ = 0;
        auVar753._0_8_ = local_e8;
        auVar368._8_8_ = 0;
        auVar368._0_8_ = uVar960;
        auVar754._8_8_ = 0;
        auVar754._0_8_ = local_f0;
        auVar2 = auVar365 * auVar751 + auVar910 + auVar366 * auVar752 + auVar367 * auVar753 +
                 auVar368 * auVar754;
        uVar950 = auVar2._0_8_;
        auVar912._8_8_ = 0;
        auVar912._0_8_ = uVar950 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar755._8_8_ = 0;
        auVar755._0_8_ = (uVar950 & 0xfffffffffffff) << 4 | (uVar942 & 0xfffffffffffff) >> 0x30;
        auVar2 = auVar364 * auVar750 + ZEXT816(0x1000003d1) * auVar755;
        uVar953 = auVar2._0_8_;
        uVar950 = uVar953 & 0xfffffffffffff;
        auVar911._8_8_ = 0;
        auVar911._0_8_ = uVar953 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar369._8_8_ = 0;
        auVar369._0_8_ = uVar931;
        auVar756._8_8_ = 0;
        auVar756._0_8_ = local_f0;
        auVar370._8_8_ = 0;
        auVar370._0_8_ = uVar948;
        auVar757._8_8_ = 0;
        auVar757._0_8_ = local_f8;
        auVar371._8_8_ = 0;
        auVar371._0_8_ = uVar949;
        auVar758._8_8_ = 0;
        auVar758._0_8_ = local_d8;
        auVar372._8_8_ = 0;
        auVar372._0_8_ = uVar952;
        auVar759._8_8_ = 0;
        auVar759._0_8_ = local_e0;
        auVar373._8_8_ = 0;
        auVar373._0_8_ = uVar960;
        auVar760._8_8_ = 0;
        auVar760._0_8_ = local_e8;
        auVar3 = auVar371 * auVar758 + auVar912 + auVar372 * auVar759 + auVar373 * auVar760;
        uVar953 = auVar3._0_8_;
        auVar374._8_8_ = 0;
        auVar374._0_8_ = uVar953 & 0xfffffffffffff;
        auVar2 = auVar369 * auVar756 + auVar911 + auVar370 * auVar757 +
                 auVar374 * ZEXT816(0x1000003d10);
        uVar955 = auVar2._0_8_;
        auVar914._8_8_ = 0;
        auVar914._0_8_ = uVar953 >> 0x34 | auVar3._8_8_ << 0xc;
        uVar953 = uVar955 & 0xfffffffffffff;
        auVar913._8_8_ = 0;
        auVar913._0_8_ = uVar955 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar375._8_8_ = 0;
        auVar375._0_8_ = uVar931;
        auVar761._8_8_ = 0;
        auVar761._0_8_ = local_e8;
        auVar376._8_8_ = 0;
        auVar376._0_8_ = uVar948;
        auVar762._8_8_ = 0;
        auVar762._0_8_ = local_f0;
        auVar377._8_8_ = 0;
        auVar377._0_8_ = uVar949;
        auVar763._8_8_ = 0;
        auVar763._0_8_ = local_f8;
        auVar378._8_8_ = 0;
        auVar378._0_8_ = uVar952;
        auVar764._8_8_ = 0;
        auVar764._0_8_ = local_d8;
        auVar379._8_8_ = 0;
        auVar379._0_8_ = uVar960;
        auVar765._8_8_ = 0;
        auVar765._0_8_ = local_e0;
        auVar3 = auVar378 * auVar764 + auVar914 + auVar379 * auVar765;
        uVar931 = auVar3._0_8_;
        auVar380._8_8_ = 0;
        auVar380._0_8_ = uVar931 & 0xfffffffffffff;
        auVar2 = auVar375 * auVar761 + auVar913 + auVar376 * auVar762 + auVar377 * auVar763 +
                 auVar380 * ZEXT816(0x1000003d10);
        uVar948 = auVar2._0_8_;
        uVar955 = uVar948 & 0xfffffffffffff;
        auVar915._8_8_ = 0;
        auVar915._0_8_ = (uVar948 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar941 & 0xfffffffffffff);
        auVar381._8_8_ = 0;
        auVar381._0_8_ = uVar931 >> 0x34 | auVar3._8_8_ << 0xc;
        auVar915 = auVar381 * ZEXT816(0x1000003d10) + auVar915;
        uVar931 = auVar915._0_8_;
        uVar941 = uVar931 & 0xfffffffffffff;
        uVar964 = (uVar931 >> 0x34 | auVar915._8_8_ << 0xc) + (uVar942 & 0xffffffffffff);
        (local_208->x).n[0] = uVar950;
        (local_208->x).n[1] = uVar953;
        (local_208->x).n[2] = uVar955;
        (local_208->x).n[3] = uVar941;
        (local_208->x).n[4] = uVar964;
        uVar965 = (local_208->x).n[1];
        uVar945 = (local_208->x).n[0] * 2;
        (local_208->x).n[0] = uVar945;
        uVar965 = uVar965 * 2;
        (local_208->x).n[1] = uVar965;
        uVar946 = (local_208->x).n[3];
        uVar966 = (local_208->x).n[2] * 2;
        (local_208->x).n[2] = uVar966;
        uVar946 = uVar946 * 2;
        (local_208->x).n[3] = uVar946;
        (local_208->x).n[4] = uVar964 * 2;
        uVar945 = uVar945 + uVar954;
        (local_208->x).n[0] = uVar945;
        uVar965 = uVar965 + uVar932;
        (local_208->x).n[1] = uVar965;
        uVar966 = uVar966 + uVar933;
        (local_208->x).n[2] = uVar966;
        uVar945 = 0x7ffff7ffffe178 - uVar945;
        uVar965 = 0x7ffffffffffff8 - uVar965;
        uVar966 = 0x7ffffffffffff8 - uVar966;
        uVar946 = uVar946 + uVar934;
        (local_208->x).n[3] = uVar946;
        (local_208->x).n[0] = uVar945;
        (local_208->x).n[1] = uVar965;
        (local_208->x).n[2] = uVar966;
        uVar946 = 0x7ffffffffffff8 - uVar946;
        (local_208->x).n[3] = uVar946;
        uVar947 = 0x7fffffffffff8 - (uVar964 * 2 + uVar961);
        (local_208->x).n[4] = uVar947;
        uVar945 = uVar945 + (uVar956 & 0xfffffffffffff);
        (local_208->x).n[0] = uVar945;
        uVar965 = uVar965 + (uVar957 & 0xfffffffffffff);
        (local_208->x).n[1] = uVar965;
        uVar966 = uVar966 + (uVar958 & 0xfffffffffffff);
        (local_208->x).n[2] = uVar966;
        uVar946 = uVar946 + (uVar959 & 0xfffffffffffff);
        (local_208->x).n[3] = uVar946;
        uVar947 = uVar947 + (uVar959 >> 0x34 | auVar880._8_8_ << 0xc) + (uVar951 & 0xffffffffffff);
        uVar945 = 0xbffff3ffffd234 - uVar945;
        uVar965 = 0xbffffffffffff4 - uVar965;
        uVar966 = 0xbffffffffffff4 - uVar966;
        (local_208->x).n[4] = uVar947;
        uVar946 = 0xbffffffffffff4 - uVar946;
        uVar947 = 0xbfffffffffff4 - uVar947;
        (local_208->y).n[0] = uVar945;
        (local_208->y).n[1] = uVar965;
        (local_208->y).n[2] = uVar966;
        (local_208->y).n[3] = uVar946;
        (local_208->y).n[4] = uVar947;
        (local_208->y).n[0] = uVar945 + uVar950;
        (local_208->y).n[1] = uVar965 + uVar953;
        (local_208->y).n[2] = uVar966 + uVar955;
        (local_208->y).n[3] = uVar946 + uVar941;
        (local_208->y).n[4] = uVar947 + uVar964;
        uVar950 = (local_208->y).n[0];
        uVar953 = (local_208->y).n[1];
        uVar955 = (local_208->y).n[2];
        uVar941 = (local_208->y).n[3];
        uVar942 = (local_208->y).n[4];
        auVar382._8_8_ = 0;
        auVar382._0_8_ = local_230.n[0];
        auVar766._8_8_ = 0;
        auVar766._0_8_ = uVar941;
        auVar383._8_8_ = 0;
        auVar383._0_8_ = local_230.n[1];
        auVar767._8_8_ = 0;
        auVar767._0_8_ = uVar955;
        auVar384._8_8_ = 0;
        auVar384._0_8_ = local_230.n[2];
        auVar768._8_8_ = 0;
        auVar768._0_8_ = uVar953;
        auVar385._8_8_ = 0;
        auVar385._0_8_ = local_230.n[3];
        auVar769._8_8_ = 0;
        auVar769._0_8_ = uVar950;
        auVar386._8_8_ = 0;
        auVar386._0_8_ = local_230.n[4];
        auVar770._8_8_ = 0;
        auVar770._0_8_ = uVar942;
        uVar931 = SUB168(auVar386 * auVar770,0);
        auVar387._8_8_ = 0;
        auVar387._0_8_ = uVar931 & 0xfffffffffffff;
        auVar2 = auVar383 * auVar767 + auVar382 * auVar766 + auVar384 * auVar768 +
                 auVar385 * auVar769 + auVar387 * ZEXT816(0x1000003d10);
        uVar948 = auVar2._0_8_;
        auVar916._8_8_ = 0;
        auVar916._0_8_ = uVar948 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar388._8_8_ = 0;
        auVar388._0_8_ = local_230.n[0];
        auVar771._8_8_ = 0;
        auVar771._0_8_ = uVar942;
        auVar389._8_8_ = 0;
        auVar389._0_8_ = local_230.n[1];
        auVar772._8_8_ = 0;
        auVar772._0_8_ = uVar941;
        auVar390._8_8_ = 0;
        auVar390._0_8_ = local_230.n[2];
        auVar773._8_8_ = 0;
        auVar773._0_8_ = uVar955;
        auVar391._8_8_ = 0;
        auVar391._0_8_ = local_230.n[3];
        auVar774._8_8_ = 0;
        auVar774._0_8_ = uVar953;
        auVar392._8_8_ = 0;
        auVar392._0_8_ = local_230.n[4];
        auVar775._8_8_ = 0;
        auVar775._0_8_ = uVar950;
        auVar393._8_8_ = 0;
        auVar393._0_8_ = uVar931 >> 0x34 | SUB168(auVar386 * auVar770,8) << 0xc;
        auVar2 = auVar388 * auVar771 + auVar916 + auVar389 * auVar772 + auVar390 * auVar773 +
                 auVar391 * auVar774 + auVar392 * auVar775 + auVar393 * ZEXT816(0x1000003d10);
        uVar931 = auVar2._0_8_;
        auVar917._8_8_ = 0;
        auVar917._0_8_ = uVar931 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar394._8_8_ = 0;
        auVar394._0_8_ = local_230.n[0];
        auVar776._8_8_ = 0;
        auVar776._0_8_ = uVar950;
        auVar395._8_8_ = 0;
        auVar395._0_8_ = local_230.n[1];
        auVar777._8_8_ = 0;
        auVar777._0_8_ = uVar942;
        auVar396._8_8_ = 0;
        auVar396._0_8_ = local_230.n[2];
        auVar778._8_8_ = 0;
        auVar778._0_8_ = uVar941;
        auVar397._8_8_ = 0;
        auVar397._0_8_ = local_230.n[3];
        auVar779._8_8_ = 0;
        auVar779._0_8_ = uVar955;
        auVar398._8_8_ = 0;
        auVar398._0_8_ = local_230.n[4];
        auVar780._8_8_ = 0;
        auVar780._0_8_ = uVar953;
        auVar2 = auVar395 * auVar777 + auVar917 + auVar396 * auVar778 + auVar397 * auVar779 +
                 auVar398 * auVar780;
        uVar949 = auVar2._0_8_;
        auVar919._8_8_ = 0;
        auVar919._0_8_ = uVar949 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar781._8_8_ = 0;
        auVar781._0_8_ = (uVar949 & 0xfffffffffffff) << 4 | (uVar931 & 0xfffffffffffff) >> 0x30;
        auVar2 = auVar394 * auVar776 + ZEXT816(0x1000003d1) * auVar781;
        uVar949 = auVar2._0_8_;
        (local_208->y).n[0] = uVar949 & 0xfffffffffffff;
        auVar918._8_8_ = 0;
        auVar918._0_8_ = uVar949 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar399._8_8_ = 0;
        auVar399._0_8_ = local_230.n[0];
        auVar782._8_8_ = 0;
        auVar782._0_8_ = uVar953;
        auVar400._8_8_ = 0;
        auVar400._0_8_ = local_230.n[1];
        auVar783._8_8_ = 0;
        auVar783._0_8_ = uVar950;
        auVar401._8_8_ = 0;
        auVar401._0_8_ = local_230.n[2];
        auVar784._8_8_ = 0;
        auVar784._0_8_ = uVar942;
        auVar402._8_8_ = 0;
        auVar402._0_8_ = local_230.n[3];
        auVar785._8_8_ = 0;
        auVar785._0_8_ = uVar941;
        auVar403._8_8_ = 0;
        auVar403._0_8_ = local_230.n[4];
        auVar786._8_8_ = 0;
        auVar786._0_8_ = uVar955;
        auVar3 = auVar401 * auVar784 + auVar919 + auVar402 * auVar785 + auVar403 * auVar786;
        uVar949 = auVar3._0_8_;
        auVar404._8_8_ = 0;
        auVar404._0_8_ = uVar949 & 0xfffffffffffff;
        auVar2 = auVar399 * auVar782 + auVar918 + auVar400 * auVar783 +
                 auVar404 * ZEXT816(0x1000003d10);
        uVar952 = auVar2._0_8_;
        auVar921._8_8_ = 0;
        auVar921._0_8_ = uVar949 >> 0x34 | auVar3._8_8_ << 0xc;
        (local_208->y).n[1] = uVar952 & 0xfffffffffffff;
        auVar920._8_8_ = 0;
        auVar920._0_8_ = uVar952 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar405._8_8_ = 0;
        auVar405._0_8_ = local_230.n[0];
        auVar787._8_8_ = 0;
        auVar787._0_8_ = uVar955;
        auVar406._8_8_ = 0;
        auVar406._0_8_ = local_230.n[1];
        auVar788._8_8_ = 0;
        auVar788._0_8_ = uVar953;
        auVar407._8_8_ = 0;
        auVar407._0_8_ = local_230.n[2];
        auVar789._8_8_ = 0;
        auVar789._0_8_ = uVar950;
        auVar408._8_8_ = 0;
        auVar408._0_8_ = local_230.n[3];
        auVar790._8_8_ = 0;
        auVar790._0_8_ = uVar942;
        auVar409._8_8_ = 0;
        auVar409._0_8_ = local_230.n[4];
        auVar791._8_8_ = 0;
        auVar791._0_8_ = uVar941;
        auVar3 = auVar408 * auVar790 + auVar921 + auVar409 * auVar791;
        uVar950 = auVar3._0_8_;
        auVar410._8_8_ = 0;
        auVar410._0_8_ = uVar950 & 0xfffffffffffff;
        auVar2 = auVar405 * auVar787 + auVar920 + auVar406 * auVar788 + auVar407 * auVar789 +
                 auVar410 * ZEXT816(0x1000003d10);
        uVar953 = auVar2._0_8_;
        (local_208->y).n[2] = uVar953 & 0xfffffffffffff;
        auVar922._8_8_ = 0;
        auVar922._0_8_ = (uVar953 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar948 & 0xfffffffffffff);
        auVar411._8_8_ = 0;
        auVar411._0_8_ = uVar950 >> 0x34 | auVar3._8_8_ << 0xc;
        auVar922 = auVar411 * ZEXT816(0x1000003d10) + auVar922;
        uVar950 = auVar922._0_8_;
        (local_208->y).n[3] = uVar950 & 0xfffffffffffff;
        (local_208->y).n[4] = (uVar950 >> 0x34 | auVar922._8_8_ << 0xc) + (uVar931 & 0xffffffffffff)
        ;
        auVar412._8_8_ = 0;
        auVar412._0_8_ = local_170;
        auVar792._8_8_ = 0;
        auVar792._0_8_ = uVar934;
        auVar413._8_8_ = 0;
        auVar413._0_8_ = local_168;
        auVar793._8_8_ = 0;
        auVar793._0_8_ = uVar933;
        auVar414._8_8_ = 0;
        auVar414._0_8_ = local_160;
        auVar794._8_8_ = 0;
        auVar794._0_8_ = uVar932;
        auVar415._8_8_ = 0;
        auVar415._0_8_ = local_158;
        auVar795._8_8_ = 0;
        auVar795._0_8_ = uVar954;
        auVar416._8_8_ = 0;
        auVar416._0_8_ = local_150;
        auVar796._8_8_ = 0;
        auVar796._0_8_ = uVar961;
        uVar950 = SUB168(auVar416 * auVar796,0);
        auVar417._8_8_ = 0;
        auVar417._0_8_ = uVar950 & 0xfffffffffffff;
        auVar2 = auVar413 * auVar793 + auVar412 * auVar792 + auVar414 * auVar794 +
                 auVar415 * auVar795 + auVar417 * ZEXT816(0x1000003d10);
        uVar953 = auVar2._0_8_;
        auVar923._8_8_ = 0;
        auVar923._0_8_ = uVar953 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar418._8_8_ = 0;
        auVar418._0_8_ = local_170;
        auVar797._8_8_ = 0;
        auVar797._0_8_ = uVar961;
        auVar419._8_8_ = 0;
        auVar419._0_8_ = local_168;
        auVar798._8_8_ = 0;
        auVar798._0_8_ = uVar934;
        auVar420._8_8_ = 0;
        auVar420._0_8_ = local_160;
        auVar799._8_8_ = 0;
        auVar799._0_8_ = uVar933;
        auVar421._8_8_ = 0;
        auVar421._0_8_ = local_158;
        auVar800._8_8_ = 0;
        auVar800._0_8_ = uVar932;
        auVar422._8_8_ = 0;
        auVar422._0_8_ = local_150;
        auVar801._8_8_ = 0;
        auVar801._0_8_ = uVar954;
        auVar423._8_8_ = 0;
        auVar423._0_8_ = uVar950 >> 0x34 | SUB168(auVar416 * auVar796,8) << 0xc;
        auVar2 = auVar418 * auVar797 + auVar923 + auVar419 * auVar798 + auVar420 * auVar799 +
                 auVar421 * auVar800 + auVar422 * auVar801 + auVar423 * ZEXT816(0x1000003d10);
        uVar950 = auVar2._0_8_;
        auVar924._8_8_ = 0;
        auVar924._0_8_ = uVar950 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar424._8_8_ = 0;
        auVar424._0_8_ = local_170;
        auVar802._8_8_ = 0;
        auVar802._0_8_ = uVar954;
        auVar425._8_8_ = 0;
        auVar425._0_8_ = local_168;
        auVar803._8_8_ = 0;
        auVar803._0_8_ = uVar961;
        auVar426._8_8_ = 0;
        auVar426._0_8_ = local_160;
        auVar804._8_8_ = 0;
        auVar804._0_8_ = uVar934;
        auVar427._8_8_ = 0;
        auVar427._0_8_ = local_158;
        auVar805._8_8_ = 0;
        auVar805._0_8_ = uVar933;
        auVar428._8_8_ = 0;
        auVar428._0_8_ = local_150;
        auVar806._8_8_ = 0;
        auVar806._0_8_ = uVar932;
        auVar2 = auVar425 * auVar803 + auVar924 + auVar426 * auVar804 + auVar427 * auVar805 +
                 auVar428 * auVar806;
        uVar955 = auVar2._0_8_;
        auVar926._8_8_ = 0;
        auVar926._0_8_ = uVar955 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar807._8_8_ = 0;
        auVar807._0_8_ = (uVar955 & 0xfffffffffffff) << 4 | (uVar950 & 0xfffffffffffff) >> 0x30;
        auVar2 = auVar424 * auVar802 + ZEXT816(0x1000003d1) * auVar807;
        uVar941 = auVar2._0_8_;
        auVar925._8_8_ = 0;
        auVar925._0_8_ = uVar941 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar429._8_8_ = 0;
        auVar429._0_8_ = local_170;
        auVar808._8_8_ = 0;
        auVar808._0_8_ = uVar932;
        auVar430._8_8_ = 0;
        auVar430._0_8_ = local_168;
        auVar809._8_8_ = 0;
        auVar809._0_8_ = uVar954;
        auVar431._8_8_ = 0;
        auVar431._0_8_ = local_160;
        auVar810._8_8_ = 0;
        auVar810._0_8_ = uVar961;
        auVar432._8_8_ = 0;
        auVar432._0_8_ = local_158;
        auVar811._8_8_ = 0;
        auVar811._0_8_ = uVar934;
        auVar433._8_8_ = 0;
        auVar433._0_8_ = local_150;
        auVar812._8_8_ = 0;
        auVar812._0_8_ = uVar933;
        auVar3 = auVar431 * auVar810 + auVar926 + auVar432 * auVar811 + auVar433 * auVar812;
        uVar955 = auVar3._0_8_;
        auVar434._8_8_ = 0;
        auVar434._0_8_ = uVar955 & 0xfffffffffffff;
        auVar2 = auVar429 * auVar808 + auVar925 + auVar430 * auVar809 +
                 auVar434 * ZEXT816(0x1000003d10);
        uVar942 = auVar2._0_8_;
        auVar928._8_8_ = 0;
        auVar928._0_8_ = uVar955 >> 0x34 | auVar3._8_8_ << 0xc;
        auVar927._8_8_ = 0;
        auVar927._0_8_ = uVar942 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar435._8_8_ = 0;
        auVar435._0_8_ = local_170;
        auVar813._8_8_ = 0;
        auVar813._0_8_ = uVar933;
        auVar436._8_8_ = 0;
        auVar436._0_8_ = local_168;
        auVar814._8_8_ = 0;
        auVar814._0_8_ = uVar932;
        auVar437._8_8_ = 0;
        auVar437._0_8_ = local_160;
        auVar815._8_8_ = 0;
        auVar815._0_8_ = uVar954;
        auVar438._8_8_ = 0;
        auVar438._0_8_ = local_158;
        auVar816._8_8_ = 0;
        auVar816._0_8_ = uVar961;
        auVar439._8_8_ = 0;
        auVar439._0_8_ = local_150;
        auVar817._8_8_ = 0;
        auVar817._0_8_ = uVar934;
        auVar3 = auVar438 * auVar816 + auVar928 + auVar439 * auVar817;
        uVar955 = auVar3._0_8_;
        auVar440._8_8_ = 0;
        auVar440._0_8_ = uVar955 & 0xfffffffffffff;
        auVar2 = auVar435 * auVar813 + auVar927 + auVar436 * auVar814 + auVar437 * auVar815 +
                 auVar440 * ZEXT816(0x1000003d10);
        uVar931 = auVar2._0_8_;
        auVar929._8_8_ = 0;
        auVar929._0_8_ = (uVar931 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar953 & 0xfffffffffffff);
        auVar441._8_8_ = 0;
        auVar441._0_8_ = uVar955 >> 0x34 | auVar3._8_8_ << 0xc;
        auVar929 = auVar441 * ZEXT816(0x1000003d10) + auVar929;
        uVar953 = auVar929._0_8_;
        (local_208->y).n[0] = (local_208->y).n[0] + (0x3ffffbfffff0bc - (uVar941 & 0xfffffffffffff))
        ;
        puVar1 = (local_208->y).n + 1;
        *puVar1 = *puVar1 + (0x3ffffffffffffc - (uVar942 & 0xfffffffffffff));
        puVar1 = (local_208->y).n + 2;
        *puVar1 = *puVar1 + (0x3ffffffffffffc - (uVar931 & 0xfffffffffffff));
        puVar1 = (local_208->y).n + 3;
        *puVar1 = *puVar1 + (0x3ffffffffffffc - (uVar953 & 0xfffffffffffff));
        puVar1 = (local_208->y).n + 4;
        *puVar1 = *puVar1 + (0x3fffffffffffc -
                            ((uVar953 >> 0x34 | auVar929._8_8_ << 0xc) + (uVar950 & 0xffffffffffff))
                            );
        return;
      }
      iVar930 = secp256k1_fe_normalizes_to_zero_var(&local_230);
      if (iVar930 != 0) {
        if (a->infinity != 0) {
          r_00->infinity = 1;
          (r_00->x).n[0] = 0;
          (r_00->x).n[1] = 0;
          (r_00->x).n[2] = 0;
          (r_00->x).n[3] = 0;
          (r_00->x).n[4] = 0;
          (r_00->y).n[0] = 0;
          (r_00->y).n[1] = 0;
          (r_00->y).n[2] = 0;
          (r_00->y).n[3] = 0;
          (r_00->y).n[4] = 0;
          (r_00->z).n[0] = 0;
          (r_00->z).n[1] = 0;
          (r_00->z).n[2] = 0;
          (r_00->z).n[3] = 0;
          (r_00->z).n[4] = 0;
          return;
        }
        secp256k1_gej_double(r_00,a);
        return;
      }
      r_00->infinity = 1;
      (r_00->x).n[0] = 0;
      (r_00->x).n[1] = 0;
      (r_00->x).n[2] = 0;
      (r_00->x).n[3] = 0;
      (r_00->x).n[4] = 0;
      (r_00->y).n[0] = 0;
      (r_00->y).n[1] = 0;
      (r_00->y).n[2] = 0;
      (r_00->y).n[3] = 0;
      (r_00->y).n[4] = 0;
      (r_00->z).n[0] = 0;
      (r_00->z).n[1] = 0;
      (r_00->z).n[2] = 0;
      (r_00->z).n[3] = 0;
      (r_00->z).n[4] = 0;
      return;
    }
    lVar940 = 0x10;
  }
  else {
    lVar940 = 0x10;
    a = b;
  }
  for (; lVar940 != 0; lVar940 = lVar940 + -1) {
    (r->x).n[0] = (a->x).n[0];
    a = (secp256k1_gej *)((a->x).n + 1);
    r = (secp256k1_gej *)((r->x).n + 1);
  }
  return;
}

Assistant:

static void secp256k1_gej_add_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_gej *b, secp256k1_fe *rzr) {
    /* Operations: 12 mul, 4 sqr, 2 normalize, 12 mul_int/add/negate */
    secp256k1_fe z22, z12, u1, u2, s1, s2, h, i, i2, h2, h3, t;

    if (a->infinity) {
        VERIFY_CHECK(rzr == NULL);
        *r = *b;
        return;
    }

    if (b->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        *r = *a;
        return;
    }

    r->infinity = 0;
    secp256k1_fe_sqr(&z22, &b->z);
    secp256k1_fe_sqr(&z12, &a->z);
    secp256k1_fe_mul(&u1, &a->x, &z22);
    secp256k1_fe_mul(&u2, &b->x, &z12);
    secp256k1_fe_mul(&s1, &a->y, &z22); secp256k1_fe_mul(&s1, &s1, &b->z);
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &a->z);
    secp256k1_fe_negate(&h, &u1, 1); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s1, 1); secp256k1_fe_add(&i, &s2);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, rzr);
        } else {
            if (rzr != NULL) {
                secp256k1_fe_set_int(rzr, 0);
            }
            secp256k1_gej_set_infinity(r);
        }
        return;
    }
    secp256k1_fe_sqr(&i2, &i);
    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_mul(&h3, &h, &h2);
    secp256k1_fe_mul(&h, &h, &b->z);
    if (rzr != NULL) {
        *rzr = h;
    }
    secp256k1_fe_mul(&r->z, &a->z, &h);
    secp256k1_fe_mul(&t, &u1, &h2);
    r->x = t; secp256k1_fe_mul_int(&r->x, 2); secp256k1_fe_add(&r->x, &h3); secp256k1_fe_negate(&r->x, &r->x, 3); secp256k1_fe_add(&r->x, &i2);
    secp256k1_fe_negate(&r->y, &r->x, 5); secp256k1_fe_add(&r->y, &t); secp256k1_fe_mul(&r->y, &r->y, &i);
    secp256k1_fe_mul(&h3, &h3, &s1); secp256k1_fe_negate(&h3, &h3, 1);
    secp256k1_fe_add(&r->y, &h3);
}